

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocs_test.cc
# Opt level: O1

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  undefined1 *puVar3;
  OcsCreateInstanceRequestType *this;
  HttpTestListener *pHVar4;
  undefined8 extraout_RAX;
  OcsActivateInstanceResponseType resp;
  OcsActivateInstanceRequestType req;
  OcsCreateInstanceResponseType resp_2;
  string local_3b8;
  long *local_398;
  undefined8 local_390;
  long local_388;
  ushort local_380;
  undefined7 *local_378;
  undefined8 local_370;
  undefined7 local_368;
  undefined1 uStack_361;
  undefined1 uStack_360;
  undefined2 uStack_35f;
  undefined1 local_35d;
  string local_358;
  undefined1 local_338 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2b8;
  undefined8 local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_298;
  undefined8 local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_278;
  undefined8 local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_258;
  undefined8 local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_238;
  undefined8 local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_218;
  undefined8 local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f8;
  undefined8 local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8;
  undefined8 local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b8;
  undefined8 local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_198;
  undefined8 local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  OcsCreateInstanceResponseType local_178;
  
  local_318._M_allocated_capacity = (size_type)&local_308;
  local_318._8_8_ = 0;
  local_308._M_local_buf[0] = '\0';
  local_2f8._M_allocated_capacity = (size_type)&local_2e8;
  local_2f8._8_8_ = 0;
  local_2e8._M_local_buf[0] = '\0';
  local_2d8._8_8_ = 0;
  local_2c8._M_local_buf[0] = '\0';
  local_2b0 = 0;
  local_2a8._M_local_buf[0] = '\0';
  local_298 = &local_288;
  local_290 = 0;
  local_288._M_local_buf[0] = '\0';
  paVar1 = &local_178.instance_id.field_2;
  local_178.instance_id.field_2._M_local_buf[0] = 'c';
  local_178.instance_id.field_2._M_allocated_capacity._1_6_ = 0x676e61682d6e;
  local_178.instance_id.field_2._M_local_buf[7] = 'z';
  local_178.instance_id.field_2._8_3_ = 0x756f68;
  local_178.instance_id._M_string_length = 0xb;
  local_178.instance_id.field_2._M_local_buf[0xb] = '\0';
  local_368 = 0x697070615f796d;
  uStack_361 = 100;
  local_370 = 8;
  uStack_360 = 0;
  local_388 = 0x65726365735f796d;
  local_390 = 9;
  local_380 = 0x74;
  local_398 = &local_388;
  local_378 = &local_368;
  local_2d8._M_allocated_capacity = (size_type)&local_2c8;
  local_2b8 = &local_2a8;
  local_178.instance_id._M_dataplus._M_p = (pointer)paVar1;
  this = (OcsCreateInstanceRequestType *)
         aliyun::Ocs::CreateOcsClient(&local_178,&local_378,&local_398);
  if (local_398 != &local_388) {
    operator_delete(local_398,local_388 + 1);
  }
  if (local_378 != &local_368) {
    operator_delete(local_378,CONCAT17(uStack_361,local_368) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.instance_id._M_dataplus._M_p != paVar1) {
    operator_delete(local_178.instance_id._M_dataplus._M_p,
                    CONCAT17(local_178.instance_id.field_2._M_local_buf[7],
                             CONCAT61(local_178.instance_id.field_2._M_allocated_capacity._1_6_,
                                      local_178.instance_id.field_2._M_local_buf[0])) + 1);
  }
  if (this == (OcsCreateInstanceRequestType *)0x0) {
    if (local_298 != &local_288) {
      operator_delete(local_298,
                      CONCAT71(local_288._M_allocated_capacity._1_7_,local_288._M_local_buf[0]) + 1)
      ;
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,
                      CONCAT71(local_2a8._M_allocated_capacity._1_7_,local_2a8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_allocated_capacity != &local_2c8) {
      operator_delete((void *)local_2d8._M_allocated_capacity,
                      CONCAT71(local_2c8._M_allocated_capacity._1_7_,local_2c8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_allocated_capacity != &local_2e8) {
      operator_delete((void *)local_2f8._M_allocated_capacity,
                      CONCAT71(local_2e8._M_allocated_capacity._1_7_,local_2e8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_allocated_capacity != &local_308) {
      operator_delete((void *)local_318._M_allocated_capacity,
                      CONCAT71(local_308._M_allocated_capacity._1_7_,local_308._M_local_buf[0]) + 1)
      ;
    }
    local_278 = &local_268;
    local_318._M_allocated_capacity = (size_type)&local_308;
    local_318._8_8_ = 0;
    local_308._M_local_buf[0] = '\0';
    local_2f8._M_allocated_capacity = (size_type)&local_2e8;
    local_2f8._8_8_ = 0;
    local_2e8._M_local_buf[0] = '\0';
    local_2d8._8_8_ = 0;
    local_2c8._M_local_buf[0] = '\0';
    local_2b0 = 0;
    local_2a8._M_local_buf[0] = '\0';
    local_298 = &local_288;
    local_290 = 0;
    local_288._M_local_buf[0] = '\0';
    local_270 = 0;
    local_268._M_local_buf[0] = '\0';
    local_178.instance_id.field_2._M_local_buf[0] = 'c';
    local_178.instance_id.field_2._M_allocated_capacity._1_6_ = 0x676e61682d6e;
    local_178.instance_id.field_2._M_local_buf[7] = 'z';
    local_178.instance_id.field_2._8_3_ = 0x756f68;
    local_178.instance_id._M_string_length = 0xb;
    local_178.instance_id.field_2._M_local_buf[0xb] = '\0';
    local_368 = 0x697070615f796d;
    uStack_361 = 100;
    local_370 = 8;
    uStack_360 = 0;
    local_388 = 0x65726365735f796d;
    local_380 = 0x74;
    local_390 = 9;
    local_398 = &local_388;
    local_378 = &local_368;
    local_2d8._M_allocated_capacity = (size_type)&local_2c8;
    local_2b8 = &local_2a8;
    local_178.instance_id._M_dataplus._M_p = (pointer)paVar1;
    this = (OcsCreateInstanceRequestType *)aliyun::Ocs::CreateOcsClient();
    if (local_398 != &local_388) {
      operator_delete(local_398,local_388 + 1);
    }
    if (local_378 != &local_368) {
      operator_delete(local_378,CONCAT17(uStack_361,local_368) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178.instance_id._M_dataplus._M_p != paVar1) {
      operator_delete(local_178.instance_id._M_dataplus._M_p,
                      CONCAT17(local_178.instance_id.field_2._M_local_buf[7],
                               CONCAT61(local_178.instance_id.field_2._M_allocated_capacity._1_6_,
                                        local_178.instance_id.field_2._M_local_buf[0])) + 1);
    }
    if (this != (OcsCreateInstanceRequestType *)0x0) goto LAB_0010866a;
    if (local_278 != &local_268) {
      operator_delete(local_278,
                      CONCAT71(local_268._M_allocated_capacity._1_7_,local_268._M_local_buf[0]) + 1)
      ;
    }
    if (local_298 != &local_288) {
      operator_delete(local_298,
                      CONCAT71(local_288._M_allocated_capacity._1_7_,local_288._M_local_buf[0]) + 1)
      ;
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,
                      CONCAT71(local_2a8._M_allocated_capacity._1_7_,local_2a8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_allocated_capacity != &local_2c8) {
      operator_delete((void *)local_2d8._M_allocated_capacity,
                      CONCAT71(local_2c8._M_allocated_capacity._1_7_,local_2c8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_allocated_capacity != &local_2e8) {
      operator_delete((void *)local_2f8._M_allocated_capacity,
                      CONCAT71(local_2e8._M_allocated_capacity._1_7_,local_2e8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_allocated_capacity != &local_308) {
      operator_delete((void *)local_318._M_allocated_capacity,
                      CONCAT71(local_308._M_allocated_capacity._1_7_,local_308._M_local_buf[0]) + 1)
      ;
    }
    local_258 = &local_248;
    local_318._M_allocated_capacity = (size_type)&local_308;
    local_318._8_8_ = 0;
    local_308._M_local_buf[0] = '\0';
    local_2f8._M_allocated_capacity = (size_type)&local_2e8;
    local_2f8._8_8_ = 0;
    local_2e8._M_local_buf[0] = '\0';
    local_2d8._8_8_ = 0;
    local_2c8._M_local_buf[0] = '\0';
    local_2b0 = 0;
    local_2a8._M_local_buf[0] = '\0';
    local_298 = &local_288;
    local_290 = 0;
    local_288._M_local_buf[0] = '\0';
    local_278 = &local_268;
    local_270 = 0;
    local_268._M_local_buf[0] = '\0';
    local_250 = 0;
    local_248._M_local_buf[0] = '\0';
    local_238 = &local_228;
    local_230 = 0;
    local_228._M_local_buf[0] = '\0';
    local_218 = &local_208;
    local_210 = 0;
    local_208._M_local_buf[0] = '\0';
    local_1f8 = &local_1e8;
    local_1f0 = 0;
    local_1e8._M_local_buf[0] = '\0';
    local_1d8 = &local_1c8;
    local_1d0 = 0;
    local_1c8._M_local_buf[0] = '\0';
    local_1b8 = &local_1a8;
    local_1b0 = 0;
    local_1a8._M_local_buf[0] = '\0';
    local_198 = &local_188;
    local_190 = 0;
    local_188._M_local_buf[0] = '\0';
    local_178.instance_name._M_dataplus._M_p = (pointer)&local_178.instance_name.field_2;
    local_178.instance_id._M_string_length = 0;
    local_178.instance_id.field_2._M_local_buf[0] = '\0';
    local_178.instance_name._M_string_length = 0;
    local_178.instance_name.field_2._M_local_buf[0] = '\0';
    local_178.connection_domain._M_dataplus._M_p = (pointer)&local_178.connection_domain.field_2;
    local_178.connection_domain._M_string_length = 0;
    local_178.connection_domain.field_2._M_local_buf[0] = '\0';
    local_178.user_name._M_dataplus._M_p = (pointer)&local_178.user_name.field_2;
    local_178.user_name._M_string_length = 0;
    local_178.user_name.field_2._M_local_buf[0] = '\0';
    local_178.instance_status._M_dataplus._M_p = (pointer)&local_178.instance_status.field_2;
    local_178.instance_status._M_string_length = 0;
    local_178.instance_status.field_2._M_local_buf[0] = '\0';
    local_178.region_id._M_dataplus._M_p = (pointer)&local_178.region_id.field_2;
    local_178.region_id._M_string_length = 0;
    local_178.region_id.field_2._M_local_buf[0] = '\0';
    local_178.zone_id._M_dataplus._M_p = (pointer)&local_178.zone_id.field_2;
    local_178.zone_id._M_string_length = 0;
    local_178.zone_id.field_2._M_local_buf[0] = '\0';
    local_178.network_type._M_dataplus._M_p = (pointer)&local_178.network_type.field_2;
    local_178.network_type._M_string_length = 0;
    local_178.network_type.field_2._M_local_buf[0] = '\0';
    local_178.private_ip_address._M_dataplus._M_p = (pointer)&local_178.private_ip_address.field_2;
    local_178.private_ip_address._M_string_length = 0;
    local_178.private_ip_address.field_2._M_local_buf[0] = '\0';
    local_368 = 0x676e61682d6e63;
    uStack_361 = 0x7a;
    uStack_360 = 0x68;
    uStack_35f = 0x756f;
    local_370 = 0xb;
    local_35d = 0;
    local_388 = 0x64697070615f796d;
    local_390 = 8;
    local_380 = local_380 & 0xff00;
    local_358.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_358.field_2._M_local_buf[7] = 'e';
    local_358.field_2._M_local_buf[8] = 't';
    local_358.field_2._M_local_buf[9] = '\0';
    local_358._M_string_length = 9;
    local_398 = &local_388;
    local_378 = &local_368;
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    local_2d8._M_allocated_capacity = (size_type)&local_2c8;
    local_2b8 = &local_2a8;
    local_178.instance_id._M_dataplus._M_p = (pointer)paVar1;
    this = (OcsCreateInstanceRequestType *)
           aliyun::Ocs::CreateOcsClient(&local_378,&local_398,&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,
                      CONCAT17(local_358.field_2._M_local_buf[7],
                               local_358.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_398 != &local_388) {
      operator_delete(local_398,local_388 + 1);
    }
    if (local_378 != &local_368) {
      operator_delete(local_378,CONCAT17(uStack_361,local_368) + 1);
    }
    if (this != (OcsCreateInstanceRequestType *)0x0) goto LAB_001087ce;
    aliyun::OcsCreateInstanceResponseType::~OcsCreateInstanceResponseType(&local_178);
    aliyun::OcsCreateInstanceRequestType::~OcsCreateInstanceRequestType
              ((OcsCreateInstanceRequestType *)&local_318);
    local_318._M_allocated_capacity = (size_type)&local_308;
    local_318._8_8_ = 0;
    local_308._M_local_buf[0] = '\0';
    local_2f8._M_allocated_capacity = (size_type)&local_2e8;
    local_2f8._8_8_ = 0;
    local_2e8._M_local_buf[0] = '\0';
    local_2d8._8_8_ = 0;
    local_2c8._M_local_buf[0] = '\0';
    local_2b0 = 0;
    local_2a8._M_local_buf[0] = '\0';
    local_298 = &local_288;
    local_290 = 0;
    local_288._M_local_buf[0] = '\0';
    local_278 = &local_268;
    local_270 = 0;
    local_268._M_local_buf[0] = '\0';
    paVar1 = &local_178.instance_id.field_2;
    local_178.instance_id._M_string_length = 0;
    local_178.instance_id.field_2._M_local_buf[0] = '\0';
    local_368 = 0x676e61682d6e63;
    uStack_361 = 0x7a;
    uStack_360 = 0x68;
    uStack_35f = 0x756f;
    local_370 = 0xb;
    local_35d = 0;
    local_388 = 0x64697070615f796d;
    local_390 = 8;
    local_380 = local_380 & 0xff00;
    local_358.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_358.field_2._M_local_buf[7] = 'e';
    local_358.field_2._M_local_buf[8] = 't';
    local_358._M_string_length = 9;
    local_358.field_2._M_local_buf[9] = '\0';
    local_398 = &local_388;
    local_378 = &local_368;
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    local_2d8._M_allocated_capacity = (size_type)&local_2c8;
    local_2b8 = &local_2a8;
    local_178.instance_id._M_dataplus._M_p = (pointer)paVar1;
    this = (OcsCreateInstanceRequestType *)aliyun::Ocs::CreateOcsClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,
                      CONCAT17(local_358.field_2._M_local_buf[7],
                               local_358.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_398 != &local_388) {
      operator_delete(local_398,local_388 + 1);
    }
    if (local_378 != &local_368) {
      operator_delete(local_378,CONCAT17(uStack_361,local_368) + 1);
    }
    if (this != (OcsCreateInstanceRequestType *)0x0) goto LAB_001089d3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178.instance_id._M_dataplus._M_p != paVar1) {
      operator_delete(local_178.instance_id._M_dataplus._M_p,
                      CONCAT17(local_178.instance_id.field_2._M_local_buf[7],
                               CONCAT61(local_178.instance_id.field_2._M_allocated_capacity._1_6_,
                                        local_178.instance_id.field_2._M_local_buf[0])) + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,
                      CONCAT71(local_268._M_allocated_capacity._1_7_,local_268._M_local_buf[0]) + 1)
      ;
    }
    if (local_298 != &local_288) {
      operator_delete(local_298,
                      CONCAT71(local_288._M_allocated_capacity._1_7_,local_288._M_local_buf[0]) + 1)
      ;
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,
                      CONCAT71(local_2a8._M_allocated_capacity._1_7_,local_2a8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_allocated_capacity != &local_2c8) {
      operator_delete((void *)local_2d8._M_allocated_capacity,
                      CONCAT71(local_2c8._M_allocated_capacity._1_7_,local_2c8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_allocated_capacity != &local_2e8) {
      operator_delete((void *)local_2f8._M_allocated_capacity,
                      CONCAT71(local_2e8._M_allocated_capacity._1_7_,local_2e8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_allocated_capacity != &local_308) {
      operator_delete((void *)local_318._M_allocated_capacity,
                      CONCAT71(local_308._M_allocated_capacity._1_7_,local_308._M_local_buf[0]) + 1)
      ;
    }
    local_318._M_allocated_capacity = (size_type)&local_308;
    local_318._8_8_ = 0;
    local_308._M_local_buf[0] = '\0';
    local_2f8._M_allocated_capacity = (size_type)&local_2e8;
    local_2f8._8_8_ = 0;
    local_2e8._M_local_buf[0] = '\0';
    local_2d8._8_8_ = 0;
    local_2c8._M_local_buf[0] = '\0';
    local_2b0 = 0;
    local_2a8._M_local_buf[0] = '\0';
    local_298 = &local_288;
    local_290 = 0;
    local_288._M_local_buf[0] = '\0';
    local_178.instance_id.field_2._M_local_buf[0] = 'c';
    local_178.instance_id.field_2._M_allocated_capacity._1_6_ = 0x676e61682d6e;
    local_178.instance_id.field_2._M_local_buf[7] = 'z';
    local_178.instance_id.field_2._8_3_ = 0x756f68;
    local_178.instance_id._M_string_length = 0xb;
    local_178.instance_id.field_2._M_local_buf[0xb] = '\0';
    local_368 = 0x697070615f796d;
    uStack_361 = 100;
    local_370 = 8;
    uStack_360 = 0;
    local_388 = 0x65726365735f796d;
    local_390 = 9;
    local_380 = 0x74;
    local_398 = &local_388;
    local_378 = &local_368;
    local_2d8._M_allocated_capacity = (size_type)&local_2c8;
    local_2b8 = &local_2a8;
    local_178.instance_id._M_dataplus._M_p = (pointer)paVar1;
    this = (OcsCreateInstanceRequestType *)aliyun::Ocs::CreateOcsClient();
    if (local_398 != &local_388) {
      operator_delete(local_398,local_388 + 1);
    }
    if (local_378 != &local_368) {
      operator_delete(local_378,CONCAT17(uStack_361,local_368) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178.instance_id._M_dataplus._M_p != paVar1) {
      operator_delete(local_178.instance_id._M_dataplus._M_p,
                      CONCAT17(local_178.instance_id.field_2._M_local_buf[7],
                               CONCAT61(local_178.instance_id.field_2._M_allocated_capacity._1_6_,
                                        local_178.instance_id.field_2._M_local_buf[0])) + 1);
    }
    if (this != (OcsCreateInstanceRequestType *)0x0) goto LAB_00108b4c;
    if (local_298 != &local_288) {
      operator_delete(local_298,
                      CONCAT71(local_288._M_allocated_capacity._1_7_,local_288._M_local_buf[0]) + 1)
      ;
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,
                      CONCAT71(local_2a8._M_allocated_capacity._1_7_,local_2a8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_allocated_capacity != &local_2c8) {
      operator_delete((void *)local_2d8._M_allocated_capacity,
                      CONCAT71(local_2c8._M_allocated_capacity._1_7_,local_2c8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_allocated_capacity != &local_2e8) {
      operator_delete((void *)local_2f8._M_allocated_capacity,
                      CONCAT71(local_2e8._M_allocated_capacity._1_7_,local_2e8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_allocated_capacity != &local_308) {
      operator_delete((void *)local_318._M_allocated_capacity,
                      CONCAT71(local_308._M_allocated_capacity._1_7_,local_308._M_local_buf[0]) + 1)
      ;
    }
    local_318._M_allocated_capacity = (size_type)&local_308;
    local_318._8_8_ = 0;
    local_308._M_local_buf[0] = '\0';
    local_2f8._M_allocated_capacity = (size_type)&local_2e8;
    local_2f8._8_8_ = 0;
    local_2e8._M_local_buf[0] = '\0';
    local_2d8._8_8_ = 0;
    local_2c8._M_local_buf[0] = '\0';
    local_2b0 = 0;
    local_2a8._M_local_buf[0] = '\0';
    local_298 = &local_288;
    local_290 = 0;
    local_288._M_local_buf[0] = '\0';
    local_178.instance_id.field_2._M_local_buf[0] = 'c';
    local_178.instance_id.field_2._M_allocated_capacity._1_6_ = 0x676e61682d6e;
    local_178.instance_id.field_2._M_local_buf[7] = 'z';
    local_178.instance_id.field_2._8_3_ = 0x756f68;
    local_178.instance_id._M_string_length = 0xb;
    local_178.instance_id.field_2._M_local_buf[0xb] = '\0';
    local_368 = 0x697070615f796d;
    uStack_361 = 100;
    local_370 = 8;
    uStack_360 = 0;
    local_388 = 0x65726365735f796d;
    local_390 = 9;
    local_380 = 0x74;
    local_398 = &local_388;
    local_378 = &local_368;
    local_2d8._M_allocated_capacity = (size_type)&local_2c8;
    local_2b8 = &local_2a8;
    local_178.instance_id._M_dataplus._M_p = (pointer)paVar1;
    this = (OcsCreateInstanceRequestType *)aliyun::Ocs::CreateOcsClient();
    if (local_398 != &local_388) {
      operator_delete(local_398,local_388 + 1);
    }
    if (local_378 != &local_368) {
      operator_delete(local_378,CONCAT17(uStack_361,local_368) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178.instance_id._M_dataplus._M_p != paVar1) {
      operator_delete(local_178.instance_id._M_dataplus._M_p,
                      CONCAT17(local_178.instance_id.field_2._M_local_buf[7],
                               CONCAT61(local_178.instance_id.field_2._M_allocated_capacity._1_6_,
                                        local_178.instance_id.field_2._M_local_buf[0])) + 1);
    }
    if (this != (OcsCreateInstanceRequestType *)0x0) goto LAB_00108c9c;
    if (local_298 != &local_288) {
      operator_delete(local_298,
                      CONCAT71(local_288._M_allocated_capacity._1_7_,local_288._M_local_buf[0]) + 1)
      ;
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,
                      CONCAT71(local_2a8._M_allocated_capacity._1_7_,local_2a8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_allocated_capacity != &local_2c8) {
      operator_delete((void *)local_2d8._M_allocated_capacity,
                      CONCAT71(local_2c8._M_allocated_capacity._1_7_,local_2c8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_allocated_capacity != &local_2e8) {
      operator_delete((void *)local_2f8._M_allocated_capacity,
                      CONCAT71(local_2e8._M_allocated_capacity._1_7_,local_2e8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_allocated_capacity != &local_308) {
      operator_delete((void *)local_318._M_allocated_capacity,
                      CONCAT71(local_308._M_allocated_capacity._1_7_,local_308._M_local_buf[0]) + 1)
      ;
    }
    local_318._M_allocated_capacity = (size_type)&local_308;
    local_318._8_8_ = 0;
    local_308._M_local_buf[0] = '\0';
    local_2f8._M_allocated_capacity = (size_type)&local_2e8;
    local_2f8._8_8_ = 0;
    local_2e8._M_local_buf[0] = '\0';
    local_2d8._8_8_ = 0;
    local_2c8._M_local_buf[0] = '\0';
    local_2b0 = 0;
    local_2a8._M_local_buf[0] = '\0';
    local_298 = &local_288;
    local_290 = 0;
    local_288._M_local_buf[0] = '\0';
    local_178.instance_id._M_string_length = 0;
    local_178.instance_id.field_2._M_local_buf[0] = '\0';
    local_368 = 0x676e61682d6e63;
    uStack_361 = 0x7a;
    uStack_360 = 0x68;
    uStack_35f = 0x756f;
    local_370 = 0xb;
    local_35d = 0;
    local_388 = 0x64697070615f796d;
    local_390 = 8;
    local_380 = local_380 & 0xff00;
    local_358.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_358.field_2._M_local_buf[7] = 'e';
    local_358.field_2._M_local_buf[8] = 't';
    local_358._M_string_length = 9;
    local_358.field_2._M_local_buf[9] = '\0';
    local_398 = &local_388;
    local_378 = &local_368;
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    local_2d8._M_allocated_capacity = (size_type)&local_2c8;
    local_2b8 = &local_2a8;
    local_178.instance_id._M_dataplus._M_p = (pointer)paVar1;
    this = (OcsCreateInstanceRequestType *)aliyun::Ocs::CreateOcsClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,
                      CONCAT17(local_358.field_2._M_local_buf[7],
                               local_358.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_398 != &local_388) {
      operator_delete(local_398,local_388 + 1);
    }
    if (local_378 != &local_368) {
      operator_delete(local_378,CONCAT17(uStack_361,local_368) + 1);
    }
    if (this != (OcsCreateInstanceRequestType *)0x0) goto LAB_00108dec;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178.instance_id._M_dataplus._M_p != paVar1) {
      operator_delete(local_178.instance_id._M_dataplus._M_p,
                      CONCAT17(local_178.instance_id.field_2._M_local_buf[7],
                               CONCAT61(local_178.instance_id.field_2._M_allocated_capacity._1_6_,
                                        local_178.instance_id.field_2._M_local_buf[0])) + 1);
    }
    if (local_298 != &local_288) {
      operator_delete(local_298,
                      CONCAT71(local_288._M_allocated_capacity._1_7_,local_288._M_local_buf[0]) + 1)
      ;
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,
                      CONCAT71(local_2a8._M_allocated_capacity._1_7_,local_2a8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_allocated_capacity != &local_2c8) {
      operator_delete((void *)local_2d8._M_allocated_capacity,
                      CONCAT71(local_2c8._M_allocated_capacity._1_7_,local_2c8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_allocated_capacity != &local_2e8) {
      operator_delete((void *)local_2f8._M_allocated_capacity,
                      CONCAT71(local_2e8._M_allocated_capacity._1_7_,local_2e8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_allocated_capacity != &local_308) {
      operator_delete((void *)local_318._M_allocated_capacity,
                      CONCAT71(local_308._M_allocated_capacity._1_7_,local_308._M_local_buf[0]) + 1)
      ;
    }
    local_318._M_allocated_capacity = (size_type)&local_308;
    local_318._8_8_ = 0;
    local_308._M_local_buf[0] = '\0';
    local_2f8._M_allocated_capacity = (size_type)&local_2e8;
    local_2f8._8_8_ = 0;
    local_2e8._M_local_buf[0] = '\0';
    local_2d8._8_8_ = 0;
    local_2c8._M_local_buf[0] = '\0';
    local_2b0 = 0;
    local_2a8._M_local_buf[0] = '\0';
    local_298 = &local_288;
    local_290 = 0;
    local_288._M_local_buf[0] = '\0';
    local_278 = &local_268;
    local_270 = 0;
    local_268._M_local_buf[0] = '\0';
    local_258 = &local_248;
    local_250 = 0;
    local_248._M_local_buf[0] = '\0';
    local_238 = &local_228;
    local_230 = 0;
    local_228._M_local_buf[0] = '\0';
    local_218 = &local_208;
    local_210 = 0;
    local_208._M_local_buf[0] = '\0';
    local_178.instance_id._M_string_length = 0;
    local_178.instance_id.field_2._M_local_buf[0] = '\0';
    local_368 = 0x676e61682d6e63;
    uStack_361 = 0x7a;
    uStack_360 = 0x68;
    uStack_35f = 0x756f;
    local_370 = 0xb;
    local_35d = 0;
    local_388 = 0x64697070615f796d;
    local_390 = 8;
    local_380 = local_380 & 0xff00;
    local_358.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_358.field_2._M_local_buf[7] = 'e';
    local_358.field_2._M_local_buf[8] = 't';
    local_358._M_string_length = 9;
    local_358.field_2._M_local_buf[9] = '\0';
    local_398 = &local_388;
    local_378 = &local_368;
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    local_2d8._M_allocated_capacity = (size_type)&local_2c8;
    local_2b8 = &local_2a8;
    local_178.instance_id._M_dataplus._M_p = (pointer)paVar1;
    this = (OcsCreateInstanceRequestType *)aliyun::Ocs::CreateOcsClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,
                      CONCAT17(local_358.field_2._M_local_buf[7],
                               local_358.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_398 != &local_388) {
      operator_delete(local_398,local_388 + 1);
    }
    if (local_378 != &local_368) {
      operator_delete(local_378,CONCAT17(uStack_361,local_368) + 1);
    }
    if (this != (OcsCreateInstanceRequestType *)0x0) goto LAB_00108f51;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178.instance_id._M_dataplus._M_p != paVar1) {
      operator_delete(local_178.instance_id._M_dataplus._M_p,
                      CONCAT17(local_178.instance_id.field_2._M_local_buf[7],
                               CONCAT61(local_178.instance_id.field_2._M_allocated_capacity._1_6_,
                                        local_178.instance_id.field_2._M_local_buf[0])) + 1);
    }
    aliyun::OcsDescribeHistoryMonitorValuesRequestType::~OcsDescribeHistoryMonitorValuesRequestType
              ((OcsDescribeHistoryMonitorValuesRequestType *)&local_318);
    local_318._M_allocated_capacity = (size_type)&local_308;
    local_318._8_8_ = 0;
    local_308._M_local_buf[0] = '\0';
    local_2f8._M_allocated_capacity = (size_type)&local_2e8;
    local_2f8._8_8_ = 0;
    local_2e8._M_local_buf[0] = '\0';
    local_2d8._8_8_ = 0;
    local_2c8._M_local_buf[0] = '\0';
    local_2b0 = 0;
    local_2a8._M_local_buf[0] = '\0';
    local_298 = &local_288;
    local_290 = 0;
    local_288._M_local_buf[0] = '\0';
    local_278 = &local_268;
    local_270 = 0;
    local_268._M_local_buf[0] = '\0';
    local_258 = &local_248;
    local_250 = 0;
    local_248._M_local_buf[0] = '\0';
    local_238 = &local_228;
    local_230 = 0;
    local_228._M_local_buf[0] = '\0';
    local_218 = &local_208;
    local_210 = 0;
    local_208._M_local_buf[0] = '\0';
    local_1f8 = &local_1e8;
    local_1f0 = 0;
    local_1e8._M_local_buf[0] = '\0';
    local_1d8 = &local_1c8;
    local_1d0 = 0;
    local_1c8._M_local_buf[0] = '\0';
    local_1b8 = &local_1a8;
    local_1b0 = 0;
    local_1a8._M_local_buf[0] = '\0';
    local_178.instance_id.field_2._M_local_buf[0] = '\0';
    local_178.instance_id.field_2._M_allocated_capacity._1_6_ = 0;
    local_178.instance_id.field_2._M_local_buf[7] = '\0';
    local_368 = 0x676e61682d6e63;
    uStack_361 = 0x7a;
    uStack_360 = 0x68;
    uStack_35f = 0x756f;
    local_370 = 0xb;
    local_35d = 0;
    local_388 = 0x64697070615f796d;
    local_390 = 8;
    local_380 = local_380 & 0xff00;
    local_358.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_358.field_2._M_local_buf[7] = 'e';
    local_358.field_2._M_local_buf[8] = 't';
    local_358._M_string_length = 9;
    local_358.field_2._M_local_buf[9] = '\0';
    local_178.instance_id._M_dataplus._M_p = (pointer)0x0;
    local_178.instance_id._M_string_length = 0;
    local_398 = &local_388;
    local_378 = &local_368;
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    local_2d8._M_allocated_capacity = (size_type)&local_2c8;
    local_2b8 = &local_2a8;
    this = (OcsCreateInstanceRequestType *)aliyun::Ocs::CreateOcsClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,
                      CONCAT17(local_358.field_2._M_local_buf[7],
                               local_358.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_398 != &local_388) {
      operator_delete(local_398,local_388 + 1);
    }
    if (local_378 != &local_368) {
      operator_delete(local_378,CONCAT17(uStack_361,local_368) + 1);
    }
    if (this != (OcsCreateInstanceRequestType *)0x0) goto LAB_00109106;
    std::
    vector<aliyun::OcsDescribeInstancesOcsInstanceType,_std::allocator<aliyun::OcsDescribeInstancesOcsInstanceType>_>
    ::~vector((vector<aliyun::OcsDescribeInstancesOcsInstanceType,_std::allocator<aliyun::OcsDescribeInstancesOcsInstanceType>_>
               *)&local_178);
    aliyun::OcsDescribeInstancesRequestType::~OcsDescribeInstancesRequestType
              ((OcsDescribeInstancesRequestType *)&local_318);
    local_318._M_allocated_capacity = (size_type)&local_308;
    local_318._8_8_ = 0;
    local_308._M_local_buf[0] = '\0';
    local_2f8._M_allocated_capacity = (size_type)&local_2e8;
    local_2f8._8_8_ = 0;
    local_2e8._M_local_buf[0] = '\0';
    local_2d8._8_8_ = 0;
    local_2c8._M_local_buf[0] = '\0';
    local_2b0 = 0;
    local_2a8._M_local_buf[0] = '\0';
    local_338._16_8_ = (pointer)0x0;
    local_338._0_8_ = (pointer)0x0;
    local_338._8_8_ = (pointer)0x0;
    paVar1 = &local_178.instance_id.field_2;
    local_178.instance_id.field_2._M_local_buf[0] = 'c';
    local_178.instance_id.field_2._M_allocated_capacity._1_6_ = 0x676e61682d6e;
    local_178.instance_id.field_2._M_local_buf[7] = 'z';
    local_178.instance_id.field_2._8_3_ = 0x756f68;
    local_178.instance_id._M_string_length = 0xb;
    local_178.instance_id.field_2._M_local_buf[0xb] = '\0';
    local_368 = 0x697070615f796d;
    uStack_361 = 100;
    local_370 = 8;
    uStack_360 = 0;
    local_388 = 0x65726365735f796d;
    local_390 = 9;
    local_380 = 0x74;
    local_398 = &local_388;
    local_378 = &local_368;
    local_2d8._M_allocated_capacity = (size_type)&local_2c8;
    local_2b8 = &local_2a8;
    local_178.instance_id._M_dataplus._M_p = (pointer)paVar1;
    this = (OcsCreateInstanceRequestType *)aliyun::Ocs::CreateOcsClient(&local_178);
    if (local_398 != &local_388) {
      operator_delete(local_398,local_388 + 1);
    }
    if (local_378 != &local_368) {
      operator_delete(local_378,CONCAT17(uStack_361,local_368) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178.instance_id._M_dataplus._M_p != paVar1) {
      operator_delete(local_178.instance_id._M_dataplus._M_p,
                      CONCAT17(local_178.instance_id.field_2._M_local_buf[7],
                               CONCAT61(local_178.instance_id.field_2._M_allocated_capacity._1_6_,
                                        local_178.instance_id.field_2._M_local_buf[0])) + 1);
    }
    if (this != (OcsCreateInstanceRequestType *)0x0) goto LAB_001092f7;
    std::
    vector<aliyun::OcsDescribeMonitorItemsOcsMonitorItemType,_std::allocator<aliyun::OcsDescribeMonitorItemsOcsMonitorItemType>_>
    ::~vector((vector<aliyun::OcsDescribeMonitorItemsOcsMonitorItemType,_std::allocator<aliyun::OcsDescribeMonitorItemsOcsMonitorItemType>_>
               *)local_338);
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,
                      CONCAT71(local_2a8._M_allocated_capacity._1_7_,local_2a8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_allocated_capacity != &local_2c8) {
      operator_delete((void *)local_2d8._M_allocated_capacity,
                      CONCAT71(local_2c8._M_allocated_capacity._1_7_,local_2c8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_allocated_capacity != &local_2e8) {
      operator_delete((void *)local_2f8._M_allocated_capacity,
                      CONCAT71(local_2e8._M_allocated_capacity._1_7_,local_2e8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_allocated_capacity != &local_308) {
      operator_delete((void *)local_318._M_allocated_capacity,
                      CONCAT71(local_308._M_allocated_capacity._1_7_,local_308._M_local_buf[0]) + 1)
      ;
    }
    local_318._M_allocated_capacity = (size_type)&local_308;
    local_318._8_8_ = 0;
    local_308._M_local_buf[0] = '\0';
    local_2f8._M_allocated_capacity = (size_type)&local_2e8;
    local_2f8._8_8_ = 0;
    local_2e8._M_local_buf[0] = '\0';
    local_2d8._8_8_ = 0;
    local_2c8._M_local_buf[0] = '\0';
    local_2b0 = 0;
    local_2a8._M_local_buf[0] = '\0';
    local_298 = &local_288;
    local_290 = 0;
    local_288._M_local_buf[0] = '\0';
    local_278 = &local_268;
    local_270 = 0;
    local_268._M_local_buf[0] = '\0';
    psVar2 = &local_178.instance_name._M_string_length;
    local_178.instance_id.field_2._M_local_buf[0] = '\0';
    local_178.instance_id.field_2._M_allocated_capacity._1_6_ = 0;
    local_178.instance_id._M_dataplus._M_p = (pointer)0x0;
    local_178.instance_id._M_string_length = 0;
    local_178.instance_id.field_2._8_3_ = SUB83(psVar2,0);
    local_178.instance_id.field_2._M_local_buf[7] = '\0';
    local_178.instance_id.field_2._M_local_buf[0xb] = (char)((ulong)psVar2 >> 0x18);
    local_178.instance_id.field_2._12_4_ = (undefined4)((ulong)psVar2 >> 0x20);
    local_178.instance_name._M_dataplus._M_p = (pointer)0x0;
    local_178.instance_name._M_string_length =
         local_178.instance_name._M_string_length & 0xffffffffffffff00;
    local_368 = 0x676e61682d6e63;
    uStack_361 = 0x7a;
    uStack_360 = 0x68;
    uStack_35f = 0x756f;
    local_370 = 0xb;
    local_35d = 0;
    local_388 = 0x64697070615f796d;
    local_390 = 8;
    local_380 = local_380 & 0xff00;
    local_358.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_358.field_2._M_local_buf[7] = 'e';
    local_358.field_2._M_local_buf[8] = 't';
    local_358._M_string_length = 9;
    local_358.field_2._M_local_buf[9] = '\0';
    local_398 = &local_388;
    local_378 = &local_368;
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    local_2d8._M_allocated_capacity = (size_type)&local_2c8;
    local_2b8 = &local_2a8;
    this = (OcsCreateInstanceRequestType *)aliyun::Ocs::CreateOcsClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,
                      CONCAT17(local_358.field_2._M_local_buf[7],
                               local_358.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_398 != &local_388) {
      operator_delete(local_398,local_388 + 1);
    }
    if (local_378 != &local_368) {
      operator_delete(local_378,CONCAT17(uStack_361,local_368) + 1);
    }
    if (this != (OcsCreateInstanceRequestType *)0x0) goto LAB_00109436;
    puVar3 = (undefined1 *)
             CONCAT44(local_178.instance_id.field_2._12_4_,
                      CONCAT13(local_178.instance_id.field_2._M_local_buf[0xb],
                               local_178.instance_id.field_2._8_3_));
    if ((size_type *)puVar3 != psVar2) {
      operator_delete(puVar3,local_178.instance_name._M_string_length + 1);
    }
    std::
    vector<aliyun::OcsDescribeMonitorValuesOcsInstanceMonitorType,_std::allocator<aliyun::OcsDescribeMonitorValuesOcsInstanceMonitorType>_>
    ::~vector((vector<aliyun::OcsDescribeMonitorValuesOcsInstanceMonitorType,_std::allocator<aliyun::OcsDescribeMonitorValuesOcsInstanceMonitorType>_>
               *)&local_178);
    paVar1 = &local_178.instance_id.field_2;
    if (local_278 != &local_268) {
      operator_delete(local_278,
                      CONCAT71(local_268._M_allocated_capacity._1_7_,local_268._M_local_buf[0]) + 1)
      ;
    }
    if (local_298 != &local_288) {
      operator_delete(local_298,
                      CONCAT71(local_288._M_allocated_capacity._1_7_,local_288._M_local_buf[0]) + 1)
      ;
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,
                      CONCAT71(local_2a8._M_allocated_capacity._1_7_,local_2a8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_allocated_capacity != &local_2c8) {
      operator_delete((void *)local_2d8._M_allocated_capacity,
                      CONCAT71(local_2c8._M_allocated_capacity._1_7_,local_2c8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_allocated_capacity != &local_2e8) {
      operator_delete((void *)local_2f8._M_allocated_capacity,
                      CONCAT71(local_2e8._M_allocated_capacity._1_7_,local_2e8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_allocated_capacity != &local_308) {
      operator_delete((void *)local_318._M_allocated_capacity,
                      CONCAT71(local_308._M_allocated_capacity._1_7_,local_308._M_local_buf[0]) + 1)
      ;
    }
    local_318._M_allocated_capacity = (size_type)&local_308;
    local_318._8_8_ = 0;
    local_308._M_local_buf[0] = '\0';
    local_2f8._M_allocated_capacity = (size_type)&local_2e8;
    local_2f8._8_8_ = 0;
    local_2e8._M_local_buf[0] = '\0';
    local_2d8._8_8_ = 0;
    local_2c8._M_local_buf[0] = '\0';
    local_2b0 = 0;
    local_2a8._M_local_buf[0] = '\0';
    local_338._16_8_ = (pointer)0x0;
    local_338._0_8_ = (pointer)0x0;
    local_338._8_8_ = (pointer)0x0;
    local_178.instance_id.field_2._M_local_buf[0] = 'c';
    local_178.instance_id.field_2._M_allocated_capacity._1_6_ = 0x676e61682d6e;
    local_178.instance_id.field_2._M_local_buf[7] = 'z';
    local_178.instance_id.field_2._8_3_ = 0x756f68;
    local_178.instance_id._M_string_length = 0xb;
    local_178.instance_id.field_2._M_local_buf[0xb] = '\0';
    local_368 = 0x697070615f796d;
    uStack_361 = 100;
    local_370 = 8;
    uStack_360 = 0;
    local_388 = 0x65726365735f796d;
    local_390 = 9;
    local_380 = 0x74;
    local_398 = &local_388;
    local_378 = &local_368;
    local_2d8._M_allocated_capacity = (size_type)&local_2c8;
    local_2b8 = &local_2a8;
    local_178.instance_id._M_dataplus._M_p = (pointer)paVar1;
    this = (OcsCreateInstanceRequestType *)aliyun::Ocs::CreateOcsClient();
    if (local_398 != &local_388) {
      operator_delete(local_398,local_388 + 1);
    }
    if (local_378 != &local_368) {
      operator_delete(local_378,CONCAT17(uStack_361,local_368) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178.instance_id._M_dataplus._M_p != paVar1) {
      operator_delete(local_178.instance_id._M_dataplus._M_p,
                      CONCAT17(local_178.instance_id.field_2._M_local_buf[7],
                               CONCAT61(local_178.instance_id.field_2._M_allocated_capacity._1_6_,
                                        local_178.instance_id.field_2._M_local_buf[0])) + 1);
    }
    if (this != (OcsCreateInstanceRequestType *)0x0) goto LAB_001095af;
    std::
    vector<aliyun::OcsDescribeRegionsOcsRegionType,_std::allocator<aliyun::OcsDescribeRegionsOcsRegionType>_>
    ::~vector((vector<aliyun::OcsDescribeRegionsOcsRegionType,_std::allocator<aliyun::OcsDescribeRegionsOcsRegionType>_>
               *)local_338);
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,
                      CONCAT71(local_2a8._M_allocated_capacity._1_7_,local_2a8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_allocated_capacity != &local_2c8) {
      operator_delete((void *)local_2d8._M_allocated_capacity,
                      CONCAT71(local_2c8._M_allocated_capacity._1_7_,local_2c8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_allocated_capacity != &local_2e8) {
      operator_delete((void *)local_2f8._M_allocated_capacity,
                      CONCAT71(local_2e8._M_allocated_capacity._1_7_,local_2e8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_allocated_capacity != &local_308) {
      operator_delete((void *)local_318._M_allocated_capacity,
                      CONCAT71(local_308._M_allocated_capacity._1_7_,local_308._M_local_buf[0]) + 1)
      ;
    }
    local_318._M_allocated_capacity = (size_type)&local_308;
    local_318._8_8_ = 0;
    local_308._M_local_buf[0] = '\0';
    local_2f8._M_allocated_capacity = (size_type)&local_2e8;
    local_2f8._8_8_ = 0;
    local_2e8._M_local_buf[0] = '\0';
    local_2d8._8_8_ = 0;
    local_2c8._M_local_buf[0] = '\0';
    local_2b0 = 0;
    local_2a8._M_local_buf[0] = '\0';
    local_298 = &local_288;
    local_290 = 0;
    local_288._M_local_buf[0] = '\0';
    local_178.instance_id._M_string_length = 0;
    local_178.instance_id.field_2._M_local_buf[0] = '\0';
    local_368 = 0x676e61682d6e63;
    uStack_361 = 0x7a;
    uStack_360 = 0x68;
    uStack_35f = 0x756f;
    local_370 = 0xb;
    local_35d = 0;
    local_388 = 0x64697070615f796d;
    local_390 = 8;
    local_380 = local_380 & 0xff00;
    local_358.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_358.field_2._M_local_buf[7] = 'e';
    local_358.field_2._M_local_buf[8] = 't';
    local_358._M_string_length = 9;
    local_358.field_2._M_local_buf[9] = '\0';
    local_398 = &local_388;
    local_378 = &local_368;
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    local_2d8._M_allocated_capacity = (size_type)&local_2c8;
    local_2b8 = &local_2a8;
    local_178.instance_id._M_dataplus._M_p = (pointer)paVar1;
    this = (OcsCreateInstanceRequestType *)aliyun::Ocs::CreateOcsClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,
                      CONCAT17(local_358.field_2._M_local_buf[7],
                               local_358.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_398 != &local_388) {
      operator_delete(local_398,local_388 + 1);
    }
    if (local_378 != &local_368) {
      operator_delete(local_378,CONCAT17(uStack_361,local_368) + 1);
    }
    if (this != (OcsCreateInstanceRequestType *)0x0) goto LAB_001096ee;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178.instance_id._M_dataplus._M_p != paVar1) {
      operator_delete(local_178.instance_id._M_dataplus._M_p,
                      CONCAT17(local_178.instance_id.field_2._M_local_buf[7],
                               CONCAT61(local_178.instance_id.field_2._M_allocated_capacity._1_6_,
                                        local_178.instance_id.field_2._M_local_buf[0])) + 1);
    }
    if (local_298 != &local_288) {
      operator_delete(local_298,
                      CONCAT71(local_288._M_allocated_capacity._1_7_,local_288._M_local_buf[0]) + 1)
      ;
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,
                      CONCAT71(local_2a8._M_allocated_capacity._1_7_,local_2a8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_allocated_capacity != &local_2c8) {
      operator_delete((void *)local_2d8._M_allocated_capacity,
                      CONCAT71(local_2c8._M_allocated_capacity._1_7_,local_2c8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_allocated_capacity != &local_2e8) {
      operator_delete((void *)local_2f8._M_allocated_capacity,
                      CONCAT71(local_2e8._M_allocated_capacity._1_7_,local_2e8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_allocated_capacity != &local_308) {
      operator_delete((void *)local_318._M_allocated_capacity,
                      CONCAT71(local_308._M_allocated_capacity._1_7_,local_308._M_local_buf[0]) + 1)
      ;
    }
    local_318._M_allocated_capacity = (size_type)&local_308;
    local_318._8_8_ = 0;
    local_308._M_local_buf[0] = '\0';
    local_2f8._M_allocated_capacity = (size_type)&local_2e8;
    local_2f8._8_8_ = 0;
    local_2e8._M_local_buf[0] = '\0';
    local_2d8._8_8_ = 0;
    local_2c8._M_local_buf[0] = '\0';
    local_2b0 = 0;
    local_2a8._M_local_buf[0] = '\0';
    local_298 = &local_288;
    local_290 = 0;
    local_288._M_local_buf[0] = '\0';
    local_338._16_8_ = (pointer)0x0;
    local_338._0_8_ = (pointer)0x0;
    local_338._8_8_ = (pointer)0x0;
    local_178.instance_id.field_2._M_local_buf[0] = 'c';
    local_178.instance_id.field_2._M_allocated_capacity._1_6_ = 0x676e61682d6e;
    local_178.instance_id.field_2._M_local_buf[7] = 'z';
    local_178.instance_id.field_2._8_3_ = 0x756f68;
    local_178.instance_id._M_string_length = 0xb;
    local_178.instance_id.field_2._M_local_buf[0xb] = '\0';
    local_368 = 0x697070615f796d;
    uStack_361 = 100;
    local_370 = 8;
    uStack_360 = 0;
    local_388 = 0x65726365735f796d;
    local_390 = 9;
    local_380 = 0x74;
    local_398 = &local_388;
    local_378 = &local_368;
    local_2d8._M_allocated_capacity = (size_type)&local_2c8;
    local_2b8 = &local_2a8;
    local_178.instance_id._M_dataplus._M_p = (pointer)paVar1;
    this = (OcsCreateInstanceRequestType *)aliyun::Ocs::CreateOcsClient();
    if (local_398 != &local_388) {
      operator_delete(local_398,local_388 + 1);
    }
    if (local_378 != &local_368) {
      operator_delete(local_378,CONCAT17(uStack_361,local_368) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178.instance_id._M_dataplus._M_p != paVar1) {
      operator_delete(local_178.instance_id._M_dataplus._M_p,
                      CONCAT17(local_178.instance_id.field_2._M_local_buf[7],
                               CONCAT61(local_178.instance_id.field_2._M_allocated_capacity._1_6_,
                                        local_178.instance_id.field_2._M_local_buf[0])) + 1);
    }
    if (this != (OcsCreateInstanceRequestType *)0x0) goto LAB_00109853;
    std::
    vector<aliyun::OcsDescribeZonesOcsZoneType,_std::allocator<aliyun::OcsDescribeZonesOcsZoneType>_>
    ::~vector((vector<aliyun::OcsDescribeZonesOcsZoneType,_std::allocator<aliyun::OcsDescribeZonesOcsZoneType>_>
               *)local_338);
    if (local_298 != &local_288) {
      operator_delete(local_298,
                      CONCAT71(local_288._M_allocated_capacity._1_7_,local_288._M_local_buf[0]) + 1)
      ;
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,
                      CONCAT71(local_2a8._M_allocated_capacity._1_7_,local_2a8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_allocated_capacity != &local_2c8) {
      operator_delete((void *)local_2d8._M_allocated_capacity,
                      CONCAT71(local_2c8._M_allocated_capacity._1_7_,local_2c8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_allocated_capacity != &local_2e8) {
      operator_delete((void *)local_2f8._M_allocated_capacity,
                      CONCAT71(local_2e8._M_allocated_capacity._1_7_,local_2e8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_allocated_capacity != &local_308) {
      operator_delete((void *)local_318._M_allocated_capacity,
                      CONCAT71(local_308._M_allocated_capacity._1_7_,local_308._M_local_buf[0]) + 1)
      ;
    }
    local_318._M_allocated_capacity = (size_type)&local_308;
    local_318._8_8_ = 0;
    local_308._M_local_buf[0] = '\0';
    local_2f8._M_allocated_capacity = (size_type)&local_2e8;
    local_2f8._8_8_ = 0;
    local_2e8._M_local_buf[0] = '\0';
    local_2d8._8_8_ = 0;
    local_2c8._M_local_buf[0] = '\0';
    local_2b0 = 0;
    local_2a8._M_local_buf[0] = '\0';
    local_298 = &local_288;
    local_290 = 0;
    local_288._M_local_buf[0] = '\0';
    local_178.instance_id.field_2._M_local_buf[0] = 'c';
    local_178.instance_id.field_2._M_allocated_capacity._1_6_ = 0x676e61682d6e;
    local_178.instance_id.field_2._M_local_buf[7] = 'z';
    local_178.instance_id.field_2._8_3_ = 0x756f68;
    local_178.instance_id._M_string_length = 0xb;
    local_178.instance_id.field_2._M_local_buf[0xb] = '\0';
    local_368 = 0x697070615f796d;
    uStack_361 = 100;
    local_370 = 8;
    uStack_360 = 0;
    local_388 = 0x65726365735f796d;
    local_390 = 9;
    local_380 = 0x74;
    local_398 = &local_388;
    local_378 = &local_368;
    local_2d8._M_allocated_capacity = (size_type)&local_2c8;
    local_2b8 = &local_2a8;
    local_178.instance_id._M_dataplus._M_p = (pointer)paVar1;
    this = (OcsCreateInstanceRequestType *)aliyun::Ocs::CreateOcsClient();
    if (local_398 != &local_388) {
      operator_delete(local_398,local_388 + 1);
    }
    if (local_378 != &local_368) {
      operator_delete(local_378,CONCAT17(uStack_361,local_368) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178.instance_id._M_dataplus._M_p != paVar1) {
      operator_delete(local_178.instance_id._M_dataplus._M_p,
                      CONCAT17(local_178.instance_id.field_2._M_local_buf[7],
                               CONCAT61(local_178.instance_id.field_2._M_allocated_capacity._1_6_,
                                        local_178.instance_id.field_2._M_local_buf[0])) + 1);
    }
    if (this != (OcsCreateInstanceRequestType *)0x0) goto LAB_001099a6;
    if (local_298 != &local_288) {
      operator_delete(local_298,
                      CONCAT71(local_288._M_allocated_capacity._1_7_,local_288._M_local_buf[0]) + 1)
      ;
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,
                      CONCAT71(local_2a8._M_allocated_capacity._1_7_,local_2a8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_allocated_capacity != &local_2c8) {
      operator_delete((void *)local_2d8._M_allocated_capacity,
                      CONCAT71(local_2c8._M_allocated_capacity._1_7_,local_2c8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_allocated_capacity != &local_2e8) {
      operator_delete((void *)local_2f8._M_allocated_capacity,
                      CONCAT71(local_2e8._M_allocated_capacity._1_7_,local_2e8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_allocated_capacity != &local_308) {
      operator_delete((void *)local_318._M_allocated_capacity,
                      CONCAT71(local_308._M_allocated_capacity._1_7_,local_308._M_local_buf[0]) + 1)
      ;
    }
    local_318._M_allocated_capacity = (size_type)&local_308;
    local_318._8_8_ = 0;
    local_308._M_local_buf[0] = '\0';
    local_2f8._M_allocated_capacity = (size_type)&local_2e8;
    local_2f8._8_8_ = 0;
    local_2e8._M_local_buf[0] = '\0';
    local_2d8._8_8_ = 0;
    local_2c8._M_local_buf[0] = '\0';
    local_2b0 = 0;
    local_2a8._M_local_buf[0] = '\0';
    local_298 = &local_288;
    local_290 = 0;
    local_288._M_local_buf[0] = '\0';
    local_278 = &local_268;
    local_270 = 0;
    local_268._M_local_buf[0] = '\0';
    local_258 = &local_248;
    local_250 = 0;
    local_248._M_local_buf[0] = '\0';
    local_178.instance_id.field_2._M_local_buf[0] = 'c';
    local_178.instance_id.field_2._M_allocated_capacity._1_6_ = 0x676e61682d6e;
    local_178.instance_id.field_2._M_local_buf[7] = 'z';
    local_178.instance_id.field_2._8_3_ = 0x756f68;
    local_178.instance_id._M_string_length = 0xb;
    local_178.instance_id.field_2._M_local_buf[0xb] = '\0';
    local_368 = 0x697070615f796d;
    uStack_361 = 100;
    local_370 = 8;
    uStack_360 = 0;
    local_388 = 0x65726365735f796d;
    local_380 = 0x74;
    local_390 = 9;
    local_398 = &local_388;
    local_378 = &local_368;
    local_2d8._M_allocated_capacity = (size_type)&local_2c8;
    local_2b8 = &local_2a8;
    local_178.instance_id._M_dataplus._M_p = (pointer)paVar1;
    this = (OcsCreateInstanceRequestType *)aliyun::Ocs::CreateOcsClient();
    if (local_398 != &local_388) {
      operator_delete(local_398,local_388 + 1);
    }
    if (local_378 != &local_368) {
      operator_delete(local_378,CONCAT17(uStack_361,local_368) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178.instance_id._M_dataplus._M_p != paVar1) {
      operator_delete(local_178.instance_id._M_dataplus._M_p,
                      CONCAT17(local_178.instance_id.field_2._M_local_buf[7],
                               CONCAT61(local_178.instance_id.field_2._M_allocated_capacity._1_6_,
                                        local_178.instance_id.field_2._M_local_buf[0])) + 1);
    }
    if (this != (OcsCreateInstanceRequestType *)0x0) goto LAB_00109af6;
    aliyun::OcsModifyInstanceAttributeRequestType::~OcsModifyInstanceAttributeRequestType
              ((OcsModifyInstanceAttributeRequestType *)&local_318);
    local_318._M_allocated_capacity = (size_type)&local_308;
    local_318._8_8_ = 0;
    local_308._M_local_buf[0] = '\0';
    local_2f8._M_allocated_capacity = (size_type)&local_2e8;
    local_2f8._8_8_ = 0;
    local_2e8._M_local_buf[0] = '\0';
    local_2d8._8_8_ = 0;
    local_2c8._M_local_buf[0] = '\0';
    local_2b0 = 0;
    local_2a8._M_local_buf[0] = '\0';
    local_298 = &local_288;
    local_290 = 0;
    local_288._M_local_buf[0] = '\0';
    local_278 = &local_268;
    local_270 = 0;
    local_268._M_local_buf[0] = '\0';
    local_178.instance_id.field_2._M_local_buf[0] = 'c';
    local_178.instance_id.field_2._M_allocated_capacity._1_6_ = 0x676e61682d6e;
    local_178.instance_id.field_2._M_local_buf[7] = 'z';
    local_178.instance_id.field_2._8_3_ = 0x756f68;
    local_178.instance_id._M_string_length = 0xb;
    local_178.instance_id.field_2._M_local_buf[0xb] = '\0';
    local_368 = 0x697070615f796d;
    uStack_361 = 100;
    local_370 = 8;
    uStack_360 = 0;
    local_388 = 0x65726365735f796d;
    local_380 = 0x74;
    local_390 = 9;
    local_398 = &local_388;
    local_378 = &local_368;
    local_2d8._M_allocated_capacity = (size_type)&local_2c8;
    local_2b8 = &local_2a8;
    local_178.instance_id._M_dataplus._M_p = (pointer)paVar1;
    this = (OcsCreateInstanceRequestType *)aliyun::Ocs::CreateOcsClient();
    if (local_398 != &local_388) {
      operator_delete(local_398,local_388 + 1);
    }
    if (local_378 != &local_368) {
      operator_delete(local_378,CONCAT17(uStack_361,local_368) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178.instance_id._M_dataplus._M_p != paVar1) {
      operator_delete(local_178.instance_id._M_dataplus._M_p,
                      CONCAT17(local_178.instance_id.field_2._M_local_buf[7],
                               CONCAT61(local_178.instance_id.field_2._M_allocated_capacity._1_6_,
                                        local_178.instance_id.field_2._M_local_buf[0])) + 1);
    }
    if (this != (OcsCreateInstanceRequestType *)0x0) goto LAB_00109c6e;
    if (local_278 != &local_268) {
      operator_delete(local_278,
                      CONCAT71(local_268._M_allocated_capacity._1_7_,local_268._M_local_buf[0]) + 1)
      ;
    }
    if (local_298 != &local_288) {
      operator_delete(local_298,
                      CONCAT71(local_288._M_allocated_capacity._1_7_,local_288._M_local_buf[0]) + 1)
      ;
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,
                      CONCAT71(local_2a8._M_allocated_capacity._1_7_,local_2a8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_allocated_capacity != &local_2c8) {
      operator_delete((void *)local_2d8._M_allocated_capacity,
                      CONCAT71(local_2c8._M_allocated_capacity._1_7_,local_2c8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_allocated_capacity != &local_2e8) {
      operator_delete((void *)local_2f8._M_allocated_capacity,
                      CONCAT71(local_2e8._M_allocated_capacity._1_7_,local_2e8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_allocated_capacity != &local_308) {
      operator_delete((void *)local_318._M_allocated_capacity,
                      CONCAT71(local_308._M_allocated_capacity._1_7_,local_308._M_local_buf[0]) + 1)
      ;
    }
    local_318._M_allocated_capacity = (size_type)&local_308;
    local_318._8_8_ = 0;
    local_308._M_local_buf[0] = '\0';
    local_2f8._M_allocated_capacity = (size_type)&local_2e8;
    local_2f8._8_8_ = 0;
    local_2e8._M_local_buf[0] = '\0';
    local_2d8._8_8_ = 0;
    local_2c8._M_local_buf[0] = '\0';
    local_2b0 = 0;
    local_2a8._M_local_buf[0] = '\0';
    local_298 = &local_288;
    local_290 = 0;
    local_288._M_local_buf[0] = '\0';
    local_278 = &local_268;
    local_270 = 0;
    local_268._M_local_buf[0] = '\0';
    local_178.instance_id.field_2._M_local_buf[0] = 'c';
    local_178.instance_id.field_2._M_allocated_capacity._1_6_ = 0x676e61682d6e;
    local_178.instance_id.field_2._M_local_buf[7] = 'z';
    local_178.instance_id.field_2._8_3_ = 0x756f68;
    local_178.instance_id._M_string_length = 0xb;
    local_178.instance_id.field_2._M_local_buf[0xb] = '\0';
    local_368 = 0x697070615f796d;
    uStack_361 = 100;
    local_370 = 8;
    uStack_360 = 0;
    local_388 = 0x65726365735f796d;
    local_380 = 0x74;
    local_390 = 9;
    local_398 = &local_388;
    local_378 = &local_368;
    local_2d8._M_allocated_capacity = (size_type)&local_2c8;
    local_2b8 = &local_2a8;
    local_178.instance_id._M_dataplus._M_p = (pointer)paVar1;
    this = (OcsCreateInstanceRequestType *)aliyun::Ocs::CreateOcsClient();
    if (local_398 != &local_388) {
      operator_delete(local_398,local_388 + 1);
    }
    if (local_378 != &local_368) {
      operator_delete(local_378,CONCAT17(uStack_361,local_368) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178.instance_id._M_dataplus._M_p != paVar1) {
      operator_delete(local_178.instance_id._M_dataplus._M_p,
                      CONCAT17(local_178.instance_id.field_2._M_local_buf[7],
                               CONCAT61(local_178.instance_id.field_2._M_allocated_capacity._1_6_,
                                        local_178.instance_id.field_2._M_local_buf[0])) + 1);
    }
    if (this != (OcsCreateInstanceRequestType *)0x0) goto LAB_00109dd2;
    if (local_278 != &local_268) {
      operator_delete(local_278,
                      CONCAT71(local_268._M_allocated_capacity._1_7_,local_268._M_local_buf[0]) + 1)
      ;
    }
    if (local_298 != &local_288) {
      operator_delete(local_298,
                      CONCAT71(local_288._M_allocated_capacity._1_7_,local_288._M_local_buf[0]) + 1)
      ;
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,
                      CONCAT71(local_2a8._M_allocated_capacity._1_7_,local_2a8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_allocated_capacity != &local_2c8) {
      operator_delete((void *)local_2d8._M_allocated_capacity,
                      CONCAT71(local_2c8._M_allocated_capacity._1_7_,local_2c8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_allocated_capacity != &local_2e8) {
      operator_delete((void *)local_2f8._M_allocated_capacity,
                      CONCAT71(local_2e8._M_allocated_capacity._1_7_,local_2e8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_allocated_capacity != &local_308) {
      operator_delete((void *)local_318._M_allocated_capacity,
                      CONCAT71(local_308._M_allocated_capacity._1_7_,local_308._M_local_buf[0]) + 1)
      ;
    }
    local_318._M_allocated_capacity = (size_type)&local_308;
    local_318._8_8_ = 0;
    local_308._M_local_buf[0] = '\0';
    local_2f8._M_allocated_capacity = (size_type)&local_2e8;
    local_2f8._8_8_ = 0;
    local_2e8._M_local_buf[0] = '\0';
    local_2d8._8_8_ = 0;
    local_2c8._M_local_buf[0] = '\0';
    local_2b0 = 0;
    local_2a8._M_local_buf[0] = '\0';
    local_298 = &local_288;
    local_290 = 0;
    local_288._M_local_buf[0] = '\0';
    local_278 = &local_268;
    local_270 = 0;
    local_268._M_local_buf[0] = '\0';
    local_178.instance_id.field_2._M_local_buf[0] = 'c';
    local_178.instance_id.field_2._M_allocated_capacity._1_6_ = 0x676e61682d6e;
    local_178.instance_id.field_2._M_local_buf[7] = 'z';
    local_178.instance_id.field_2._8_3_ = 0x756f68;
    local_178.instance_id._M_string_length = 0xb;
    local_178.instance_id.field_2._M_local_buf[0xb] = '\0';
    local_368 = 0x697070615f796d;
    uStack_361 = 100;
    local_370 = 8;
    uStack_360 = 0;
    local_388 = 0x65726365735f796d;
    local_380 = 0x74;
    local_390 = 9;
    local_398 = &local_388;
    local_378 = &local_368;
    local_2d8._M_allocated_capacity = (size_type)&local_2c8;
    local_2b8 = &local_2a8;
    local_178.instance_id._M_dataplus._M_p = (pointer)paVar1;
    this = (OcsCreateInstanceRequestType *)aliyun::Ocs::CreateOcsClient();
    if (local_398 != &local_388) {
      operator_delete(local_398,local_388 + 1);
    }
    if (local_378 != &local_368) {
      operator_delete(local_378,CONCAT17(uStack_361,local_368) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178.instance_id._M_dataplus._M_p != paVar1) {
      operator_delete(local_178.instance_id._M_dataplus._M_p,
                      CONCAT17(local_178.instance_id.field_2._M_local_buf[7],
                               CONCAT61(local_178.instance_id.field_2._M_allocated_capacity._1_6_,
                                        local_178.instance_id.field_2._M_local_buf[0])) + 1);
    }
    if (this != (OcsCreateInstanceRequestType *)0x0) goto LAB_00109f36;
    if (local_278 != &local_268) {
      operator_delete(local_278,
                      CONCAT71(local_268._M_allocated_capacity._1_7_,local_268._M_local_buf[0]) + 1)
      ;
    }
    if (local_298 != &local_288) {
      operator_delete(local_298,
                      CONCAT71(local_288._M_allocated_capacity._1_7_,local_288._M_local_buf[0]) + 1)
      ;
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,
                      CONCAT71(local_2a8._M_allocated_capacity._1_7_,local_2a8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_allocated_capacity != &local_2c8) {
      operator_delete((void *)local_2d8._M_allocated_capacity,
                      CONCAT71(local_2c8._M_allocated_capacity._1_7_,local_2c8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_allocated_capacity != &local_2e8) {
      operator_delete((void *)local_2f8._M_allocated_capacity,
                      CONCAT71(local_2e8._M_allocated_capacity._1_7_,local_2e8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_allocated_capacity != &local_308) {
      operator_delete((void *)local_318._M_allocated_capacity,
                      CONCAT71(local_308._M_allocated_capacity._1_7_,local_308._M_local_buf[0]) + 1)
      ;
    }
    local_318._M_allocated_capacity = (size_type)&local_308;
    local_318._8_8_ = 0;
    local_308._M_local_buf[0] = '\0';
    local_2f8._M_allocated_capacity = (size_type)&local_2e8;
    local_2f8._8_8_ = 0;
    local_2e8._M_local_buf[0] = '\0';
    local_2d8._8_8_ = 0;
    local_2c8._M_local_buf[0] = '\0';
    local_2b0 = 0;
    local_2a8._M_local_buf[0] = '\0';
    local_298 = &local_288;
    local_290 = 0;
    local_288._M_local_buf[0] = '\0';
    local_278 = &local_268;
    local_270 = 0;
    local_268._M_local_buf[0] = '\0';
    local_258 = &local_248;
    local_250 = 0;
    local_248._M_local_buf[0] = '\0';
    local_178.instance_id.field_2._M_local_buf[0] = 'c';
    local_178.instance_id.field_2._M_allocated_capacity._1_6_ = 0x676e61682d6e;
    local_178.instance_id.field_2._M_local_buf[7] = 'z';
    local_178.instance_id.field_2._8_3_ = 0x756f68;
    local_178.instance_id._M_string_length = 0xb;
    local_178.instance_id.field_2._M_local_buf[0xb] = '\0';
    local_368 = 0x697070615f796d;
    uStack_361 = 100;
    local_370 = 8;
    uStack_360 = 0;
    local_388 = 0x65726365735f796d;
    local_380 = 0x74;
    local_390 = 9;
    local_398 = &local_388;
    local_378 = &local_368;
    local_2d8._M_allocated_capacity = (size_type)&local_2c8;
    local_2b8 = &local_2a8;
    local_178.instance_id._M_dataplus._M_p = (pointer)paVar1;
    this = (OcsCreateInstanceRequestType *)aliyun::Ocs::CreateOcsClient();
    if (local_398 != &local_388) {
      operator_delete(local_398,local_388 + 1);
    }
    if (local_378 != &local_368) {
      operator_delete(local_378,CONCAT17(uStack_361,local_368) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178.instance_id._M_dataplus._M_p != paVar1) {
      operator_delete(local_178.instance_id._M_dataplus._M_p,
                      CONCAT17(local_178.instance_id.field_2._M_local_buf[7],
                               CONCAT61(local_178.instance_id.field_2._M_allocated_capacity._1_6_,
                                        local_178.instance_id.field_2._M_local_buf[0])) + 1);
    }
    if (this == (OcsCreateInstanceRequestType *)0x0) {
      aliyun::OcsReplaceAuthenticIPRequestType::~OcsReplaceAuthenticIPRequestType
                ((OcsReplaceAuthenticIPRequestType *)&local_318);
      local_318._M_allocated_capacity = (size_type)&local_308;
      local_318._8_8_ = 0;
      local_308._M_local_buf[0] = '\0';
      local_2f8._M_allocated_capacity = (size_type)&local_2e8;
      local_2f8._8_8_ = 0;
      local_2e8._M_local_buf[0] = '\0';
      local_2d8._8_8_ = 0;
      local_2c8._M_local_buf[0] = '\0';
      local_2b0 = 0;
      local_2a8._M_local_buf[0] = '\0';
      local_298 = &local_288;
      local_290 = 0;
      local_288._M_local_buf[0] = '\0';
      local_278 = &local_268;
      local_270 = 0;
      local_268._M_local_buf[0] = '\0';
      local_178.instance_id.field_2._M_local_buf[0] = 'c';
      local_178.instance_id.field_2._M_allocated_capacity._1_6_ = 0x676e61682d6e;
      local_178.instance_id.field_2._M_local_buf[7] = 'z';
      local_178.instance_id.field_2._8_3_ = 0x756f68;
      local_178.instance_id._M_string_length = 0xb;
      local_178.instance_id.field_2._M_local_buf[0xb] = '\0';
      local_368 = 0x697070615f796d;
      uStack_361 = 100;
      local_370 = 8;
      uStack_360 = 0;
      local_388 = 0x65726365735f796d;
      local_380 = 0x74;
      local_390 = 9;
      local_398 = &local_388;
      local_378 = &local_368;
      local_2d8._M_allocated_capacity = (size_type)&local_2c8;
      local_2b8 = &local_2a8;
      local_178.instance_id._M_dataplus._M_p = (pointer)paVar1;
      this = (OcsCreateInstanceRequestType *)aliyun::Ocs::CreateOcsClient();
      if (local_398 != &local_388) {
        operator_delete(local_398,local_388 + 1);
      }
      if (local_378 != &local_368) {
        operator_delete(local_378,CONCAT17(uStack_361,local_368) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178.instance_id._M_dataplus._M_p != paVar1) {
        operator_delete(local_178.instance_id._M_dataplus._M_p,
                        CONCAT17(local_178.instance_id.field_2._M_local_buf[7],
                                 CONCAT61(local_178.instance_id.field_2._M_allocated_capacity._1_6_,
                                          local_178.instance_id.field_2._M_local_buf[0])) + 1);
      }
      if (this == (OcsCreateInstanceRequestType *)0x0) {
        if (local_278 != &local_268) {
          operator_delete(local_278,
                          CONCAT71(local_268._M_allocated_capacity._1_7_,local_268._M_local_buf[0])
                          + 1);
        }
        if (local_298 != &local_288) {
          operator_delete(local_298,
                          CONCAT71(local_288._M_allocated_capacity._1_7_,local_288._M_local_buf[0])
                          + 1);
        }
        if (local_2b8 != &local_2a8) {
          operator_delete(local_2b8,
                          CONCAT71(local_2a8._M_allocated_capacity._1_7_,local_2a8._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_allocated_capacity != &local_2c8) {
          operator_delete((void *)local_2d8._M_allocated_capacity,
                          CONCAT71(local_2c8._M_allocated_capacity._1_7_,local_2c8._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._M_allocated_capacity != &local_2e8) {
          operator_delete((void *)local_2f8._M_allocated_capacity,
                          CONCAT71(local_2e8._M_allocated_capacity._1_7_,local_2e8._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_allocated_capacity != &local_308) {
          operator_delete((void *)local_318._M_allocated_capacity,
                          CONCAT71(local_308._M_allocated_capacity._1_7_,local_308._M_local_buf[0])
                          + 1);
        }
        return 0;
      }
      goto LAB_0010a212;
    }
  }
  else {
    local_358.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_358.field_2._M_local_buf[7] = '.';
    local_358.field_2._M_local_buf[8] = '1';
    local_358.field_2._M_local_buf[9] = ':';
    local_358.field_2._10_5_ = 0x3433323231;
    local_358._M_string_length = 0xf;
    local_358.field_2._M_local_buf[0xf] = '\0';
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    aliyun::Ocs::SetProxyHost((Ocs *)this,&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,
                      CONCAT17(local_358.field_2._M_local_buf[7],
                               local_358.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_3b8.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
    local_3b8._M_string_length = 2;
    local_3b8.field_2._M_local_buf[2] = '\0';
    local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
    HttpTestListener::SetResponseBody(pHVar4,&local_3b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
      operator_delete(local_3b8._M_dataplus._M_p,
                      CONCAT17(local_3b8.field_2._M_local_buf[7],
                               CONCAT43(local_3b8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_3b8.field_2._M_local_buf[2],
                                                 local_3b8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_318._M_local_buf,"OwnerId");
    std::__cxx11::string::operator=((string *)local_2f8._M_local_buf,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_2d8._M_local_buf,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_2b8,"OwnerAccount");
    std::__cxx11::string::operator=((string *)&local_298,"InstanceId");
    aliyun::Ocs::ActivateInstance
              ((OcsActivateInstanceRequestType *)this,
               (OcsActivateInstanceResponseType *)local_318._M_local_buf,(OcsErrorInfo *)local_338);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_1();
LAB_0010866a:
    local_358.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_358.field_2._M_local_buf[7] = '.';
    local_358.field_2._M_local_buf[8] = '1';
    local_358.field_2._M_local_buf[9] = ':';
    local_358.field_2._10_5_ = 0x3433323231;
    local_358._M_string_length = 0xf;
    local_358.field_2._M_local_buf[0xf] = '\0';
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    aliyun::Ocs::SetProxyHost((Ocs *)this,&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,
                      CONCAT17(local_358.field_2._M_local_buf[7],
                               local_358.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_3b8.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
    local_3b8._M_string_length = 2;
    local_3b8.field_2._M_local_buf[2] = '\0';
    local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
    HttpTestListener::SetResponseBody(pHVar4,&local_3b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
      operator_delete(local_3b8._M_dataplus._M_p,
                      CONCAT17(local_3b8.field_2._M_local_buf[7],
                               CONCAT43(local_3b8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_3b8.field_2._M_local_buf[2],
                                                 local_3b8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_318._M_local_buf,"OwnerId");
    std::__cxx11::string::operator=((string *)local_2f8._M_local_buf,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_2d8._M_local_buf,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_2b8,"OwnerAccount");
    std::__cxx11::string::operator=((string *)&local_298,"InstanceId");
    std::__cxx11::string::operator=((string *)&local_278,"AuthenticIP");
    aliyun::Ocs::AddAuthenticIP
              ((OcsAddAuthenticIPRequestType *)this,
               (OcsAddAuthenticIPResponseType *)local_318._M_local_buf,(OcsErrorInfo *)local_338);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_2();
LAB_001087ce:
    local_3b8.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_3b8.field_2._M_local_buf[2] = '7';
    local_3b8.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_3b8.field_2._M_local_buf[7] = '.';
    local_3b8.field_2._8_7_ = 0x34333232313a31;
    local_3b8._M_string_length = 0xf;
    local_3b8.field_2._M_local_buf[0xf] = '\0';
    local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
    aliyun::Ocs::SetProxyHost((Ocs *)this,&local_3b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
      operator_delete(local_3b8._M_dataplus._M_p,
                      CONCAT17(local_3b8.field_2._M_local_buf[7],
                               CONCAT43(local_3b8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_3b8.field_2._M_local_buf[2],
                                                 local_3b8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_338._0_8_ = (pointer)(local_338 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,
               "{  \"InstanceId\": \"InstanceId\",  \"InstanceName\": \"InstanceName\",  \"ConnectionDomain\": \"ConnectionDomain\",  \"Port\": 0,  \"UserName\": \"UserName\",  \"InstanceStatus\": \"InstanceStatus\",  \"RegionId\": \"RegionId\",  \"ZoneId\": \"ZoneId\",  \"Capacity\": 0,  \"QPS\": 0,  \"Bandwidth\": 0,  \"Connections\": 0,  \"NetworkType\": \"NetworkType\",  \"PrivateIpAddress\": \"PrivateIpAddress\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar4,(string *)local_338);
    if ((pointer)local_338._0_8_ != (pointer)(local_338 + 0x10)) {
      operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_318._M_local_buf,"OwnerId");
    std::__cxx11::string::operator=((string *)local_2f8._M_local_buf,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_2d8._M_local_buf,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_2b8,"OwnerAccount");
    std::__cxx11::string::operator=((string *)&local_298,"Password");
    std::__cxx11::string::operator=((string *)&local_278,"Capacity");
    std::__cxx11::string::operator=((string *)&local_258,"InstanceName");
    std::__cxx11::string::operator=((string *)&local_238,"ZoneId");
    std::__cxx11::string::operator=((string *)&local_218,"NetworkType");
    std::__cxx11::string::operator=((string *)&local_1f8,"VpcId");
    std::__cxx11::string::operator=((string *)&local_1d8,"VSwitchId");
    std::__cxx11::string::operator=((string *)&local_1b8,"PrivateIpAddress");
    std::__cxx11::string::operator=((string *)&local_198,"Token");
    aliyun::Ocs::CreateInstance
              (this,(OcsCreateInstanceResponseType *)&local_318,(OcsErrorInfo *)&local_178);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_3();
LAB_001089d3:
    local_3b8.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_3b8.field_2._M_local_buf[2] = '7';
    local_3b8.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_3b8.field_2._M_local_buf[7] = '.';
    local_3b8.field_2._8_7_ = 0x34333232313a31;
    local_3b8._M_string_length = 0xf;
    local_3b8.field_2._M_local_buf[0xf] = '\0';
    local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
    aliyun::Ocs::SetProxyHost((Ocs *)this,&local_3b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
      operator_delete(local_3b8._M_dataplus._M_p,
                      CONCAT17(local_3b8.field_2._M_local_buf[7],
                               CONCAT43(local_3b8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_3b8.field_2._M_local_buf[2],
                                                 local_3b8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_338._0_8_ = (pointer)(local_338 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"{  \"CommandResult\": \"CommandResult\"}","");
    HttpTestListener::SetResponseBody(pHVar4,(string *)local_338);
    if ((pointer)local_338._0_8_ != (pointer)(local_338 + 0x10)) {
      operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_318._M_local_buf,"OwnerId");
    std::__cxx11::string::operator=((string *)local_2f8._M_local_buf,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_2d8._M_local_buf,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_2b8,"OwnerAccount");
    std::__cxx11::string::operator=((string *)&local_298,"InstanceId");
    std::__cxx11::string::operator=((string *)&local_278,"Command");
    aliyun::Ocs::DataOperate
              ((OcsDataOperateRequestType *)this,(OcsDataOperateResponseType *)&local_318,
               (OcsErrorInfo *)&local_178);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_4();
LAB_00108b4c:
    local_358.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_358.field_2._M_local_buf[7] = '.';
    local_358.field_2._M_local_buf[8] = '1';
    local_358.field_2._M_local_buf[9] = ':';
    local_358.field_2._10_5_ = 0x3433323231;
    local_358._M_string_length = 0xf;
    local_358.field_2._M_local_buf[0xf] = '\0';
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    aliyun::Ocs::SetProxyHost((Ocs *)this,&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,
                      CONCAT17(local_358.field_2._M_local_buf[7],
                               local_358.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_3b8.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
    local_3b8._M_string_length = 2;
    local_3b8.field_2._M_local_buf[2] = '\0';
    local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
    HttpTestListener::SetResponseBody(pHVar4,&local_3b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
      operator_delete(local_3b8._M_dataplus._M_p,
                      CONCAT17(local_3b8.field_2._M_local_buf[7],
                               CONCAT43(local_3b8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_3b8.field_2._M_local_buf[2],
                                                 local_3b8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_318._M_local_buf,"OwnerId");
    std::__cxx11::string::operator=((string *)local_2f8._M_local_buf,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_2d8._M_local_buf,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_2b8,"OwnerAccount");
    std::__cxx11::string::operator=((string *)&local_298,"InstanceId");
    aliyun::Ocs::DeactivateInstance
              ((OcsDeactivateInstanceRequestType *)this,
               (OcsDeactivateInstanceResponseType *)local_318._M_local_buf,(OcsErrorInfo *)local_338
              );
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_5();
LAB_00108c9c:
    local_358.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_358.field_2._M_local_buf[7] = '.';
    local_358.field_2._M_local_buf[8] = '1';
    local_358.field_2._M_local_buf[9] = ':';
    local_358.field_2._10_5_ = 0x3433323231;
    local_358._M_string_length = 0xf;
    local_358.field_2._M_local_buf[0xf] = '\0';
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    aliyun::Ocs::SetProxyHost((Ocs *)this,&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,
                      CONCAT17(local_358.field_2._M_local_buf[7],
                               local_358.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_3b8.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
    local_3b8._M_string_length = 2;
    local_3b8.field_2._M_local_buf[2] = '\0';
    local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
    HttpTestListener::SetResponseBody(pHVar4,&local_3b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
      operator_delete(local_3b8._M_dataplus._M_p,
                      CONCAT17(local_3b8.field_2._M_local_buf[7],
                               CONCAT43(local_3b8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_3b8.field_2._M_local_buf[2],
                                                 local_3b8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_318._M_local_buf,"OwnerId");
    std::__cxx11::string::operator=((string *)local_2f8._M_local_buf,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_2d8._M_local_buf,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_2b8,"OwnerAccount");
    std::__cxx11::string::operator=((string *)&local_298,"InstanceId");
    aliyun::Ocs::DeleteInstance
              ((OcsDeleteInstanceRequestType *)this,
               (OcsDeleteInstanceResponseType *)local_318._M_local_buf,(OcsErrorInfo *)local_338);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_6();
LAB_00108dec:
    local_3b8.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_3b8.field_2._M_local_buf[2] = '7';
    local_3b8.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_3b8.field_2._M_local_buf[7] = '.';
    local_3b8.field_2._8_7_ = 0x34333232313a31;
    local_3b8._M_string_length = 0xf;
    local_3b8.field_2._M_local_buf[0xf] = '\0';
    local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
    aliyun::Ocs::SetProxyHost((Ocs *)this,&local_3b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
      operator_delete(local_3b8._M_dataplus._M_p,
                      CONCAT17(local_3b8.field_2._M_local_buf[7],
                               CONCAT43(local_3b8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_3b8.field_2._M_local_buf[2],
                                                 local_3b8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_338._0_8_ = (pointer)(local_338 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"{  \"AuthenticIPs\": \"AuthenticIPs\"}","");
    HttpTestListener::SetResponseBody(pHVar4,(string *)local_338);
    if ((pointer)local_338._0_8_ != (pointer)(local_338 + 0x10)) {
      operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_318._M_local_buf,"OwnerId");
    std::__cxx11::string::operator=((string *)local_2f8._M_local_buf,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_2d8._M_local_buf,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_2b8,"OwnerAccount");
    std::__cxx11::string::operator=((string *)&local_298,"InstanceId");
    aliyun::Ocs::DescribeAuthenticIP
              ((OcsDescribeAuthenticIPRequestType *)this,
               (OcsDescribeAuthenticIPResponseType *)&local_318,(OcsErrorInfo *)&local_178);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_7();
LAB_00108f51:
    local_3b8.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_3b8.field_2._M_local_buf[2] = '7';
    local_3b8.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_3b8.field_2._M_local_buf[7] = '.';
    local_3b8.field_2._8_7_ = 0x34333232313a31;
    local_3b8._M_string_length = 0xf;
    local_3b8.field_2._M_local_buf[0xf] = '\0';
    local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
    aliyun::Ocs::SetProxyHost((Ocs *)this,&local_3b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
      operator_delete(local_3b8._M_dataplus._M_p,
                      CONCAT17(local_3b8.field_2._M_local_buf[7],
                               CONCAT43(local_3b8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_3b8.field_2._M_local_buf[2],
                                                 local_3b8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_338._0_8_ = (pointer)(local_338 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"{  \"MonitorHistory\": \"MonitorHistory\"}","");
    HttpTestListener::SetResponseBody(pHVar4,(string *)local_338);
    if ((pointer)local_338._0_8_ != (pointer)(local_338 + 0x10)) {
      operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_318._M_local_buf,"OwnerId");
    std::__cxx11::string::operator=((string *)local_2f8._M_local_buf,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_2d8._M_local_buf,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_2b8,"OwnerAccount");
    std::__cxx11::string::operator=((string *)&local_298,"InstanceId");
    std::__cxx11::string::operator=((string *)&local_278,"MonitorKeys");
    std::__cxx11::string::operator=((string *)&local_258,"StartTime");
    std::__cxx11::string::operator=((string *)&local_238,"EndTime");
    std::__cxx11::string::operator=((string *)&local_218,"IntervalForHistory");
    aliyun::Ocs::DescribeHistoryMonitorValues
              ((OcsDescribeHistoryMonitorValuesRequestType *)this,
               (OcsDescribeHistoryMonitorValuesResponseType *)&local_318,(OcsErrorInfo *)&local_178)
    ;
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_8();
LAB_00109106:
    local_3b8.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_3b8.field_2._M_local_buf[2] = '7';
    local_3b8.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_3b8.field_2._M_local_buf[7] = '.';
    local_3b8.field_2._8_7_ = 0x34333232313a31;
    local_3b8._M_string_length = 0xf;
    local_3b8.field_2._M_local_buf[0xf] = '\0';
    local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
    aliyun::Ocs::SetProxyHost((Ocs *)this,&local_3b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
      operator_delete(local_3b8._M_dataplus._M_p,
                      CONCAT17(local_3b8.field_2._M_local_buf[7],
                               CONCAT43(local_3b8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_3b8.field_2._M_local_buf[2],
                                                 local_3b8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_338._0_8_ = (pointer)(local_338 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,
               "{  \"Instances\": {    \"OcsInstance\": [      {        \"InstanceId\": \"InstanceId\",        \"InstanceName\": \"InstanceName\",        \"ConnectionDomain\": \"ConnectionDomain\",        \"Port\": 0,        \"UserName\": \"UserName\",        \"InstanceStatus\": \"InstanceStatus\",        \"Capacity\": 0,        \"QPS\": 0,        \"Bandwidth\": 0,        \"Connections\": 0,        \"RegionId\": \"RegionId\",        \"ZoneId\": \"ZoneId\",        \"NetworkType\": \"NetworkType\",        \"VpcId\": \"VpcId\",        \"VSwitchId\": \"VSwitchId\",        \"PrivateIpAddress\": \"PrivateIpAddress\",        \"CreationTime\": \"CreationTime\"      }    ]  },  \"TotalCount\": 0,  \"PageNumber\": 0,  \"PageSize\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar4,(string *)local_338);
    if ((pointer)local_338._0_8_ != (pointer)(local_338 + 0x10)) {
      operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_318._M_local_buf,"OwnerId");
    std::__cxx11::string::operator=((string *)local_2f8._M_local_buf,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_2d8._M_local_buf,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_2b8,"OwnerAccount");
    std::__cxx11::string::operator=((string *)&local_298,"InstanceIds");
    std::__cxx11::string::operator=((string *)&local_278,"InstanceStatus");
    std::__cxx11::string::operator=((string *)&local_258,"PageNumber");
    std::__cxx11::string::operator=((string *)&local_238,"PageSize");
    std::__cxx11::string::operator=((string *)&local_218,"NetworkType");
    std::__cxx11::string::operator=((string *)&local_1f8,"VpcId");
    std::__cxx11::string::operator=((string *)&local_1d8,"VSwitchId");
    std::__cxx11::string::operator=((string *)&local_1b8,"PrivateIpAddresses");
    aliyun::Ocs::DescribeInstances
              ((OcsDescribeInstancesRequestType *)this,
               (OcsDescribeInstancesResponseType *)&local_318,(OcsErrorInfo *)&local_178);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_9();
LAB_001092f7:
    local_358.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_358.field_2._M_local_buf[7] = '.';
    local_358.field_2._M_local_buf[8] = '1';
    local_358.field_2._M_local_buf[9] = ':';
    local_358.field_2._10_5_ = 0x3433323231;
    local_358._M_string_length = 0xf;
    local_358.field_2._M_local_buf[0xf] = '\0';
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    aliyun::Ocs::SetProxyHost((Ocs *)this,&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,
                      CONCAT17(local_358.field_2._M_local_buf[7],
                               local_358.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3b8,
               "{  \"MonitorItems\": {    \"OcsMonitorItem\": [      {        \"MonitorKey\": \"MonitorKey\",        \"Unit\": \"Unit\"      }    ]  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar4,&local_3b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
      operator_delete(local_3b8._M_dataplus._M_p,
                      CONCAT17(local_3b8.field_2._M_local_buf[7],
                               CONCAT43(local_3b8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_3b8.field_2._M_local_buf[2],
                                                 local_3b8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_318._M_local_buf,"OwnerId");
    std::__cxx11::string::operator=((string *)local_2f8._M_local_buf,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_2d8._M_local_buf,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_2b8,"OwnerAccount");
    aliyun::Ocs::DescribeMonitorItems
              ((OcsDescribeMonitorItemsRequestType *)this,
               (OcsDescribeMonitorItemsResponseType *)&local_318,(OcsErrorInfo *)local_338);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_10();
LAB_00109436:
    local_3b8.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_3b8.field_2._M_local_buf[2] = '7';
    local_3b8.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_3b8.field_2._M_local_buf[7] = '.';
    local_3b8.field_2._8_7_ = 0x34333232313a31;
    local_3b8._M_string_length = 0xf;
    local_3b8.field_2._M_local_buf[0xf] = '\0';
    local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
    aliyun::Ocs::SetProxyHost((Ocs *)this,&local_3b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
      operator_delete(local_3b8._M_dataplus._M_p,
                      CONCAT17(local_3b8.field_2._M_local_buf[7],
                               CONCAT43(local_3b8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_3b8.field_2._M_local_buf[2],
                                                 local_3b8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_338._0_8_ = (pointer)(local_338 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,
               "{  \"InstanceIds\": {    \"OcsInstanceMonitor\": [      {        \"MonitorKeys\": {          \"OcsMonitorKey\": [            {              \"MonitorKey\": \"MonitorKey\",              \"Value\": \"Value\",              \"Unit\": \"Unit\"            }          ]        },        \"InstanceId\": \"InstanceId\"      }    ]  },  \"Date\": \"Date\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar4,(string *)local_338);
    if ((pointer)local_338._0_8_ != (pointer)(local_338 + 0x10)) {
      operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_318._M_local_buf,"OwnerId");
    std::__cxx11::string::operator=((string *)local_2f8._M_local_buf,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_2d8._M_local_buf,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_2b8,"OwnerAccount");
    std::__cxx11::string::operator=((string *)&local_298,"InstanceIds");
    std::__cxx11::string::operator=((string *)&local_278,"MonitorKeys");
    aliyun::Ocs::DescribeMonitorValues
              ((OcsDescribeMonitorValuesRequestType *)this,
               (OcsDescribeMonitorValuesResponseType *)&local_318,(OcsErrorInfo *)&local_178);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_11();
LAB_001095af:
    local_358.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_358.field_2._M_local_buf[7] = '.';
    local_358.field_2._M_local_buf[8] = '1';
    local_358.field_2._M_local_buf[9] = ':';
    local_358.field_2._10_5_ = 0x3433323231;
    local_358._M_string_length = 0xf;
    local_358.field_2._M_local_buf[0xf] = '\0';
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    aliyun::Ocs::SetProxyHost((Ocs *)this,&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,
                      CONCAT17(local_358.field_2._M_local_buf[7],
                               local_358.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3b8,
               "{  \"RegionIds\": {    \"OcsRegion\": [      {        \"RegionId\": \"RegionId\",        \"ZoneIds\": \"ZoneIds\",        \"LocalName\": \"LocalName\"      }    ]  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar4,&local_3b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
      operator_delete(local_3b8._M_dataplus._M_p,
                      CONCAT17(local_3b8.field_2._M_local_buf[7],
                               CONCAT43(local_3b8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_3b8.field_2._M_local_buf[2],
                                                 local_3b8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_318._M_local_buf,"OwnerId");
    std::__cxx11::string::operator=((string *)local_2f8._M_local_buf,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_2d8._M_local_buf,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_2b8,"OwnerAccount");
    aliyun::Ocs::DescribeRegions
              ((OcsDescribeRegionsRequestType *)this,(OcsDescribeRegionsResponseType *)&local_318,
               (OcsErrorInfo *)local_338);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_12();
LAB_001096ee:
    local_3b8.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_3b8.field_2._M_local_buf[2] = '7';
    local_3b8.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_3b8.field_2._M_local_buf[7] = '.';
    local_3b8.field_2._8_7_ = 0x34333232313a31;
    local_3b8._M_string_length = 0xf;
    local_3b8.field_2._M_local_buf[0xf] = '\0';
    local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
    aliyun::Ocs::SetProxyHost((Ocs *)this,&local_3b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
      operator_delete(local_3b8._M_dataplus._M_p,
                      CONCAT17(local_3b8.field_2._M_local_buf[7],
                               CONCAT43(local_3b8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_3b8.field_2._M_local_buf[2],
                                                 local_3b8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_338._0_8_ = (pointer)(local_338 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"{  \"SecurityIps\": \"SecurityIps\"}","");
    HttpTestListener::SetResponseBody(pHVar4,(string *)local_338);
    if ((pointer)local_338._0_8_ != (pointer)(local_338 + 0x10)) {
      operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_318._M_local_buf,"OwnerId");
    std::__cxx11::string::operator=((string *)local_2f8._M_local_buf,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_2d8._M_local_buf,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_2b8,"OwnerAccount");
    std::__cxx11::string::operator=((string *)&local_298,"InstanceId");
    aliyun::Ocs::DescribeSecurityIps
              ((OcsDescribeSecurityIpsRequestType *)this,
               (OcsDescribeSecurityIpsResponseType *)&local_318,(OcsErrorInfo *)&local_178);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_13();
LAB_00109853:
    local_358.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_358.field_2._M_local_buf[7] = '.';
    local_358.field_2._M_local_buf[8] = '1';
    local_358.field_2._M_local_buf[9] = ':';
    local_358.field_2._10_5_ = 0x3433323231;
    local_358._M_string_length = 0xf;
    local_358.field_2._M_local_buf[0xf] = '\0';
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    aliyun::Ocs::SetProxyHost((Ocs *)this,&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,
                      CONCAT17(local_358.field_2._M_local_buf[7],
                               local_358.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3b8,
               "{  \"Zones\": {    \"OcsZone\": [      {        \"ZoneId\": \"ZoneId\",        \"Name\": \"Name\",        \"Description\": \"Description\"      }    ]  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar4,&local_3b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
      operator_delete(local_3b8._M_dataplus._M_p,
                      CONCAT17(local_3b8.field_2._M_local_buf[7],
                               CONCAT43(local_3b8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_3b8.field_2._M_local_buf[2],
                                                 local_3b8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_318._M_local_buf,"OwnerId");
    std::__cxx11::string::operator=((string *)local_2f8._M_local_buf,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_2d8._M_local_buf,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_2b8,"OwnerAccount");
    std::__cxx11::string::operator=((string *)&local_298,"ZoneId");
    aliyun::Ocs::DescribeZones
              ((OcsDescribeZonesRequestType *)this,(OcsDescribeZonesResponseType *)&local_318,
               (OcsErrorInfo *)local_338);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_14();
LAB_001099a6:
    local_358.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_358.field_2._M_local_buf[7] = '.';
    local_358.field_2._M_local_buf[8] = '1';
    local_358.field_2._M_local_buf[9] = ':';
    local_358.field_2._10_5_ = 0x3433323231;
    local_358._M_string_length = 0xf;
    local_358.field_2._M_local_buf[0xf] = '\0';
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    aliyun::Ocs::SetProxyHost((Ocs *)this,&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,
                      CONCAT17(local_358.field_2._M_local_buf[7],
                               local_358.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_3b8.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
    local_3b8._M_string_length = 2;
    local_3b8.field_2._M_local_buf[2] = '\0';
    local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
    HttpTestListener::SetResponseBody(pHVar4,&local_3b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
      operator_delete(local_3b8._M_dataplus._M_p,
                      CONCAT17(local_3b8.field_2._M_local_buf[7],
                               CONCAT43(local_3b8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_3b8.field_2._M_local_buf[2],
                                                 local_3b8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_318._M_local_buf,"OwnerId");
    std::__cxx11::string::operator=((string *)local_2f8._M_local_buf,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_2d8._M_local_buf,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_2b8,"OwnerAccount");
    std::__cxx11::string::operator=((string *)&local_298,"InstanceId");
    aliyun::Ocs::FlushInstance
              ((OcsFlushInstanceRequestType *)this,
               (OcsFlushInstanceResponseType *)local_318._M_local_buf,(OcsErrorInfo *)local_338);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_15();
LAB_00109af6:
    local_358.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_358.field_2._M_local_buf[7] = '.';
    local_358.field_2._M_local_buf[8] = '1';
    local_358.field_2._M_local_buf[9] = ':';
    local_358.field_2._10_5_ = 0x3433323231;
    local_358._M_string_length = 0xf;
    local_358.field_2._M_local_buf[0xf] = '\0';
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    aliyun::Ocs::SetProxyHost((Ocs *)this,&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,
                      CONCAT17(local_358.field_2._M_local_buf[7],
                               local_358.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_3b8.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
    local_3b8._M_string_length = 2;
    local_3b8.field_2._M_local_buf[2] = '\0';
    local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
    HttpTestListener::SetResponseBody(pHVar4,&local_3b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
      operator_delete(local_3b8._M_dataplus._M_p,
                      CONCAT17(local_3b8.field_2._M_local_buf[7],
                               CONCAT43(local_3b8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_3b8.field_2._M_local_buf[2],
                                                 local_3b8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_318._M_local_buf,"OwnerId");
    std::__cxx11::string::operator=((string *)local_2f8._M_local_buf,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_2d8._M_local_buf,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_2b8,"OwnerAccount");
    std::__cxx11::string::operator=((string *)&local_298,"InstanceId");
    std::__cxx11::string::operator=((string *)&local_278,"InstanceName");
    std::__cxx11::string::operator=((string *)&local_258,"NewPassword");
    aliyun::Ocs::ModifyInstanceAttribute
              ((OcsModifyInstanceAttributeRequestType *)this,
               (OcsModifyInstanceAttributeResponseType *)local_318._M_local_buf,
               (OcsErrorInfo *)local_338);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_16();
LAB_00109c6e:
    local_358.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_358.field_2._M_local_buf[7] = '.';
    local_358.field_2._M_local_buf[8] = '1';
    local_358.field_2._M_local_buf[9] = ':';
    local_358.field_2._10_5_ = 0x3433323231;
    local_358._M_string_length = 0xf;
    local_358.field_2._M_local_buf[0xf] = '\0';
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    aliyun::Ocs::SetProxyHost((Ocs *)this,&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,
                      CONCAT17(local_358.field_2._M_local_buf[7],
                               local_358.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_3b8.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
    local_3b8._M_string_length = 2;
    local_3b8.field_2._M_local_buf[2] = '\0';
    local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
    HttpTestListener::SetResponseBody(pHVar4,&local_3b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
      operator_delete(local_3b8._M_dataplus._M_p,
                      CONCAT17(local_3b8.field_2._M_local_buf[7],
                               CONCAT43(local_3b8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_3b8.field_2._M_local_buf[2],
                                                 local_3b8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_318._M_local_buf,"OwnerId");
    std::__cxx11::string::operator=((string *)local_2f8._M_local_buf,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_2d8._M_local_buf,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_2b8,"OwnerAccount");
    std::__cxx11::string::operator=((string *)&local_298,"InstanceId");
    std::__cxx11::string::operator=((string *)&local_278,"Capacity");
    aliyun::Ocs::ModifyInstanceCapacity
              ((OcsModifyInstanceCapacityRequestType *)this,
               (OcsModifyInstanceCapacityResponseType *)local_318._M_local_buf,
               (OcsErrorInfo *)local_338);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_17();
LAB_00109dd2:
    local_358.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_358.field_2._M_local_buf[7] = '.';
    local_358.field_2._M_local_buf[8] = '1';
    local_358.field_2._M_local_buf[9] = ':';
    local_358.field_2._10_5_ = 0x3433323231;
    local_358._M_string_length = 0xf;
    local_358.field_2._M_local_buf[0xf] = '\0';
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    aliyun::Ocs::SetProxyHost((Ocs *)this,&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,
                      CONCAT17(local_358.field_2._M_local_buf[7],
                               local_358.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_3b8.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
    local_3b8._M_string_length = 2;
    local_3b8.field_2._M_local_buf[2] = '\0';
    local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
    HttpTestListener::SetResponseBody(pHVar4,&local_3b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
      operator_delete(local_3b8._M_dataplus._M_p,
                      CONCAT17(local_3b8.field_2._M_local_buf[7],
                               CONCAT43(local_3b8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_3b8.field_2._M_local_buf[2],
                                                 local_3b8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_318._M_local_buf,"OwnerId");
    std::__cxx11::string::operator=((string *)local_2f8._M_local_buf,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_2d8._M_local_buf,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_2b8,"OwnerAccount");
    std::__cxx11::string::operator=((string *)&local_298,"InstanceId");
    std::__cxx11::string::operator=((string *)&local_278,"SecurityIps");
    aliyun::Ocs::ModifySecurityIps
              ((OcsModifySecurityIpsRequestType *)this,
               (OcsModifySecurityIpsResponseType *)local_318._M_local_buf,(OcsErrorInfo *)local_338)
    ;
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_18();
LAB_00109f36:
    local_358.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_358.field_2._M_local_buf[7] = '.';
    local_358.field_2._M_local_buf[8] = '1';
    local_358.field_2._M_local_buf[9] = ':';
    local_358.field_2._10_5_ = 0x3433323231;
    local_358._M_string_length = 0xf;
    local_358.field_2._M_local_buf[0xf] = '\0';
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    aliyun::Ocs::SetProxyHost((Ocs *)this,&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,
                      CONCAT17(local_358.field_2._M_local_buf[7],
                               local_358.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_3b8.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
    local_3b8._M_string_length = 2;
    local_3b8.field_2._M_local_buf[2] = '\0';
    local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
    HttpTestListener::SetResponseBody(pHVar4,&local_3b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
      operator_delete(local_3b8._M_dataplus._M_p,
                      CONCAT17(local_3b8.field_2._M_local_buf[7],
                               CONCAT43(local_3b8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_3b8.field_2._M_local_buf[2],
                                                 local_3b8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_318._M_local_buf,"OwnerId");
    std::__cxx11::string::operator=((string *)local_2f8._M_local_buf,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_2d8._M_local_buf,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_2b8,"OwnerAccount");
    std::__cxx11::string::operator=((string *)&local_298,"InstanceId");
    std::__cxx11::string::operator=((string *)&local_278,"AuthenticIP");
    aliyun::Ocs::RemoveAuthenticIP
              ((OcsRemoveAuthenticIPRequestType *)this,
               (OcsRemoveAuthenticIPResponseType *)local_318._M_local_buf,(OcsErrorInfo *)local_338)
    ;
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_19();
  }
  local_358.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
  local_358.field_2._M_local_buf[7] = '.';
  local_358.field_2._M_local_buf[8] = '1';
  local_358.field_2._M_local_buf[9] = ':';
  local_358.field_2._10_5_ = 0x3433323231;
  local_358._M_string_length = 0xf;
  local_358.field_2._M_local_buf[0xf] = '\0';
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  aliyun::Ocs::SetProxyHost((Ocs *)this,&local_358);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,
                    CONCAT17(local_358.field_2._M_local_buf[7],
                             local_358.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
    *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
  }
  pHVar4 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar4,0x2fca);
  local_3b8.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
  local_3b8._M_string_length = 2;
  local_3b8.field_2._M_local_buf[2] = '\0';
  local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
  HttpTestListener::SetResponseBody(pHVar4,&local_3b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p,
                    CONCAT17(local_3b8.field_2._M_local_buf[7],
                             CONCAT43(local_3b8.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_3b8.field_2._M_local_buf[2],
                                               local_3b8.field_2._M_allocated_capacity._0_2_))) + 1)
    ;
  }
  HttpTestListener::Start(pHVar4);
  std::__cxx11::string::operator=((string *)local_318._M_local_buf,"OwnerId");
  std::__cxx11::string::operator=((string *)local_2f8._M_local_buf,"ResourceOwnerAccount");
  std::__cxx11::string::operator=((string *)local_2d8._M_local_buf,"ResourceOwnerId");
  std::__cxx11::string::operator=((string *)&local_2b8,"OwnerAccount");
  std::__cxx11::string::operator=((string *)&local_298,"InstanceId");
  std::__cxx11::string::operator=((string *)&local_278,"OldAuthenticIP");
  std::__cxx11::string::operator=((string *)&local_258,"NewAuthenticIP");
  aliyun::Ocs::ReplaceAuthenticIP
            ((OcsReplaceAuthenticIPRequestType *)this,
             (OcsReplaceAuthenticIPResponseType *)local_318._M_local_buf,(OcsErrorInfo *)local_338);
  HttpTestListener::WaitComplete(pHVar4);
  main_cold_20();
LAB_0010a212:
  local_358.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
  local_358.field_2._M_local_buf[7] = '.';
  local_358.field_2._M_local_buf[8] = '1';
  local_358.field_2._M_local_buf[9] = ':';
  local_358.field_2._10_5_ = 0x3433323231;
  local_358._M_string_length = 0xf;
  local_358.field_2._M_local_buf[0xf] = '\0';
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  aliyun::Ocs::SetProxyHost((Ocs *)this,&local_358);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,
                    CONCAT17(local_358.field_2._M_local_buf[7],
                             local_358.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
    *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
  }
  pHVar4 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar4,0x2fca);
  local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"{  \"Result\": true}","");
  HttpTestListener::SetResponseBody(pHVar4,&local_3b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p,
                    CONCAT17(local_3b8.field_2._M_local_buf[7],
                             CONCAT43(local_3b8.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_3b8.field_2._M_local_buf[2],
                                               local_3b8.field_2._M_allocated_capacity._0_2_))) + 1)
    ;
  }
  HttpTestListener::Start(pHVar4);
  std::__cxx11::string::operator=((string *)local_318._M_local_buf,"OwnerId");
  std::__cxx11::string::operator=((string *)local_2f8._M_local_buf,"ResourceOwnerAccount");
  std::__cxx11::string::operator=((string *)local_2d8._M_local_buf,"ResourceOwnerId");
  std::__cxx11::string::operator=((string *)&local_2b8,"OwnerAccount");
  std::__cxx11::string::operator=((string *)&local_298,"InstanceId");
  std::__cxx11::string::operator=((string *)&local_278,"Password");
  aliyun::Ocs::VerifyPassword
            ((OcsVerifyPasswordRequestType *)this,
             (OcsVerifyPasswordResponseType *)local_318._M_local_buf,(OcsErrorInfo *)local_338);
  HttpTestListener::WaitComplete(pHVar4);
  main_cold_21();
  aliyun::OcsCreateInstanceResponseType::~OcsCreateInstanceResponseType(&local_178);
  aliyun::OcsCreateInstanceRequestType::~OcsCreateInstanceRequestType
            ((OcsCreateInstanceRequestType *)&local_318);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main() {
  test_activate_instance();
  test_add_authentic_ip();
  test_create_instance();
  test_data_operate();
  test_deactivate_instance();
  test_delete_instance();
  test_describe_authentic_ip();
  test_describe_history_monitor_values();
  test_describe_instances();
  test_describe_monitor_items();
  test_describe_monitor_values();
  test_describe_regions();
  test_describe_security_ips();
  test_describe_zones();
  test_flush_instance();
  test_modify_instance_attribute();
  test_modify_instance_capacity();
  test_modify_security_ips();
  test_remove_authentic_ip();
  test_replace_authentic_ip();
  test_verify_password();
}